

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [12];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  int iVar66;
  int iVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  ulong uVar75;
  int iVar76;
  ulong uVar77;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar78;
  long lVar79;
  byte bVar80;
  byte bVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar137;
  uint uVar138;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar139;
  uint uVar143;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float pp;
  float fVar144;
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar166;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar167 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar212 [32];
  float fVar226;
  undefined1 auVar217 [16];
  float fVar216;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar225;
  float fVar227;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar229;
  undefined1 auVar228 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  float fVar235;
  undefined1 auVar236 [32];
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar237 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [28];
  float fVar244;
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9f0 [16];
  ulong local_9d8;
  uint local_9cc;
  float local_9c8;
  float local_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [16];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCHitN local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  uint local_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint uStack_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar250 [64];
  
  PVar1 = prim[1];
  uVar82 = (ulong)(byte)PVar1;
  fVar235 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar92 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar91 = vsubps_avx(auVar87,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  fVar207 = fVar235 * auVar91._0_4_;
  fVar144 = fVar235 * auVar92._0_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar82 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar87);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar82 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar94);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar82 * 6 + 6);
  auVar101 = vpmovsxbd_avx2(auVar88);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar102 = vpmovsxbd_avx2(auVar93);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar107 = vpmovsxbd_avx2(auVar85);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar103 = vcvtdq2ps_avx(auVar107);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar82 + 6);
  auVar99 = vpmovsxbd_avx2(auVar217);
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar75 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar104 = vpmovsxbd_avx2(auVar89);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar75 + uVar82 + 6);
  auVar105 = vpmovsxbd_avx2(auVar86);
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar77 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar97 = vpmovsxbd_avx2(auVar90);
  auVar106 = vcvtdq2ps_avx(auVar97);
  auVar117._4_4_ = fVar144;
  auVar117._0_4_ = fVar144;
  auVar117._8_4_ = fVar144;
  auVar117._12_4_ = fVar144;
  auVar117._16_4_ = fVar144;
  auVar117._20_4_ = fVar144;
  auVar117._24_4_ = fVar144;
  auVar117._28_4_ = fVar144;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar109 = ZEXT1632(CONCAT412(fVar235 * auVar92._12_4_,
                                CONCAT48(fVar235 * auVar92._8_4_,
                                         CONCAT44(fVar235 * auVar92._4_4_,fVar144))));
  auVar108 = vpermps_avx2(auVar119,auVar109);
  auVar96 = vpermps_avx512vl(auVar95,auVar109);
  fVar144 = auVar96._0_4_;
  fVar238 = auVar96._4_4_;
  auVar109._4_4_ = fVar238 * auVar101._4_4_;
  auVar109._0_4_ = fVar144 * auVar101._0_4_;
  fVar239 = auVar96._8_4_;
  auVar109._8_4_ = fVar239 * auVar101._8_4_;
  fVar240 = auVar96._12_4_;
  auVar109._12_4_ = fVar240 * auVar101._12_4_;
  fVar213 = auVar96._16_4_;
  auVar109._16_4_ = fVar213 * auVar101._16_4_;
  fVar214 = auVar96._20_4_;
  auVar109._20_4_ = fVar214 * auVar101._20_4_;
  fVar215 = auVar96._24_4_;
  auVar109._24_4_ = fVar215 * auVar101._24_4_;
  auVar109._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar99._4_4_ * fVar238;
  auVar107._0_4_ = auVar99._0_4_ * fVar144;
  auVar107._8_4_ = auVar99._8_4_ * fVar239;
  auVar107._12_4_ = auVar99._12_4_ * fVar240;
  auVar107._16_4_ = auVar99._16_4_ * fVar213;
  auVar107._20_4_ = auVar99._20_4_ * fVar214;
  auVar107._24_4_ = auVar99._24_4_ * fVar215;
  auVar107._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar106._4_4_ * fVar238;
  auVar97._0_4_ = auVar106._0_4_ * fVar144;
  auVar97._8_4_ = auVar106._8_4_ * fVar239;
  auVar97._12_4_ = auVar106._12_4_ * fVar240;
  auVar97._16_4_ = auVar106._16_4_ * fVar213;
  auVar97._20_4_ = auVar106._20_4_ * fVar214;
  auVar97._24_4_ = auVar106._24_4_ * fVar215;
  auVar97._28_4_ = auVar96._28_4_;
  auVar87 = vfmadd231ps_fma(auVar109,auVar108,auVar98);
  auVar94 = vfmadd231ps_fma(auVar107,auVar108,auVar103);
  auVar88 = vfmadd231ps_fma(auVar97,auVar105,auVar108);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar117,auVar100);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar117,auVar102);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar104,auVar117);
  auVar118._4_4_ = fVar207;
  auVar118._0_4_ = fVar207;
  auVar118._8_4_ = fVar207;
  auVar118._12_4_ = fVar207;
  auVar118._16_4_ = fVar207;
  auVar118._20_4_ = fVar207;
  auVar118._24_4_ = fVar207;
  auVar118._28_4_ = fVar207;
  auVar97 = ZEXT1632(CONCAT412(fVar235 * auVar91._12_4_,
                               CONCAT48(fVar235 * auVar91._8_4_,
                                        CONCAT44(fVar235 * auVar91._4_4_,fVar207))));
  auVar107 = vpermps_avx2(auVar119,auVar97);
  auVar97 = vpermps_avx512vl(auVar95,auVar97);
  fVar235 = auVar97._0_4_;
  fVar144 = auVar97._4_4_;
  auVar108._4_4_ = fVar144 * auVar101._4_4_;
  auVar108._0_4_ = fVar235 * auVar101._0_4_;
  fVar238 = auVar97._8_4_;
  auVar108._8_4_ = fVar238 * auVar101._8_4_;
  fVar239 = auVar97._12_4_;
  auVar108._12_4_ = fVar239 * auVar101._12_4_;
  fVar240 = auVar97._16_4_;
  auVar108._16_4_ = fVar240 * auVar101._16_4_;
  fVar213 = auVar97._20_4_;
  auVar108._20_4_ = fVar213 * auVar101._20_4_;
  fVar214 = auVar97._24_4_;
  auVar108._24_4_ = fVar214 * auVar101._24_4_;
  auVar108._28_4_ = 1;
  auVar95._4_4_ = auVar99._4_4_ * fVar144;
  auVar95._0_4_ = auVar99._0_4_ * fVar235;
  auVar95._8_4_ = auVar99._8_4_ * fVar238;
  auVar95._12_4_ = auVar99._12_4_ * fVar239;
  auVar95._16_4_ = auVar99._16_4_ * fVar240;
  auVar95._20_4_ = auVar99._20_4_ * fVar213;
  auVar95._24_4_ = auVar99._24_4_ * fVar214;
  auVar95._28_4_ = auVar101._28_4_;
  auVar99._4_4_ = auVar106._4_4_ * fVar144;
  auVar99._0_4_ = auVar106._0_4_ * fVar235;
  auVar99._8_4_ = auVar106._8_4_ * fVar238;
  auVar99._12_4_ = auVar106._12_4_ * fVar239;
  auVar99._16_4_ = auVar106._16_4_ * fVar240;
  auVar99._20_4_ = auVar106._20_4_ * fVar213;
  auVar99._24_4_ = auVar106._24_4_ * fVar214;
  auVar99._28_4_ = auVar97._28_4_;
  auVar93 = vfmadd231ps_fma(auVar108,auVar107,auVar98);
  auVar85 = vfmadd231ps_fma(auVar95,auVar107,auVar103);
  auVar217 = vfmadd231ps_fma(auVar99,auVar107,auVar105);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar118,auVar100);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar118,auVar102);
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  auVar217 = vfmadd231ps_fma(ZEXT1632(auVar217),auVar118,auVar104);
  auVar100 = vandps_avx(ZEXT1632(auVar87),auVar114);
  auVar116._8_4_ = 0x219392ef;
  auVar116._0_8_ = 0x219392ef219392ef;
  auVar116._12_4_ = 0x219392ef;
  auVar116._16_4_ = 0x219392ef;
  auVar116._20_4_ = 0x219392ef;
  auVar116._24_4_ = 0x219392ef;
  auVar116._28_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar100,auVar116,1);
  bVar5 = (bool)((byte)uVar75 & 1);
  auVar96._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar87._0_4_;
  bVar5 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar87._4_4_;
  bVar5 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar87._8_4_;
  bVar5 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar87._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar94),auVar114);
  uVar75 = vcmpps_avx512vl(auVar100,auVar116,1);
  bVar5 = (bool)((byte)uVar75 & 1);
  auVar110._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar94._0_4_;
  bVar5 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar94._4_4_;
  bVar5 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar94._8_4_;
  bVar5 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar94._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar88),auVar114);
  uVar75 = vcmpps_avx512vl(auVar100,auVar116,1);
  bVar5 = (bool)((byte)uVar75 & 1);
  auVar100._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._0_4_;
  bVar5 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._4_4_;
  bVar5 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._8_4_;
  bVar5 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar96);
  auVar115._8_4_ = 0x3f800000;
  auVar115._0_8_ = 0x3f8000003f800000;
  auVar115._12_4_ = 0x3f800000;
  auVar115._16_4_ = 0x3f800000;
  auVar115._20_4_ = 0x3f800000;
  auVar115._24_4_ = 0x3f800000;
  auVar115._28_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar96,auVar98,auVar115);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar110);
  auVar94 = vfnmadd213ps_fma(auVar110,auVar98,auVar115);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar100);
  auVar88 = vfnmadd213ps_fma(auVar100,auVar98,auVar115);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar98,auVar98);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar93));
  auVar104._4_4_ = auVar87._4_4_ * auVar100._4_4_;
  auVar104._0_4_ = auVar87._0_4_ * auVar100._0_4_;
  auVar104._8_4_ = auVar87._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar87._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 9 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar93));
  auVar99 = vpbroadcastd_avx512vl();
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar113._0_4_ = auVar87._0_4_ * auVar100._0_4_;
  auVar113._4_4_ = auVar87._4_4_ * auVar100._4_4_;
  auVar113._8_4_ = auVar87._8_4_ * auVar100._8_4_;
  auVar113._12_4_ = auVar87._12_4_ * auVar100._12_4_;
  auVar113._16_4_ = auVar100._16_4_ * 0.0;
  auVar113._20_4_ = auVar100._20_4_ * 0.0;
  auVar113._24_4_ = auVar100._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar82 * -2 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar85));
  auVar105._4_4_ = auVar94._4_4_ * auVar100._4_4_;
  auVar105._0_4_ = auVar94._0_4_ * auVar100._0_4_;
  auVar105._8_4_ = auVar94._8_4_ * auVar100._8_4_;
  auVar105._12_4_ = auVar94._12_4_ * auVar100._12_4_;
  auVar105._16_4_ = auVar100._16_4_ * 0.0;
  auVar105._20_4_ = auVar100._20_4_ * 0.0;
  auVar105._24_4_ = auVar100._24_4_ * 0.0;
  auVar105._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar98);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar85));
  auVar112._0_4_ = auVar94._0_4_ * auVar100._0_4_;
  auVar112._4_4_ = auVar94._4_4_ * auVar100._4_4_;
  auVar112._8_4_ = auVar94._8_4_ * auVar100._8_4_;
  auVar112._12_4_ = auVar94._12_4_ * auVar100._12_4_;
  auVar112._16_4_ = auVar100._16_4_ * 0.0;
  auVar112._20_4_ = auVar100._20_4_ * 0.0;
  auVar112._24_4_ = auVar100._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 + uVar82 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar217));
  auVar106._4_4_ = auVar100._4_4_ * auVar88._4_4_;
  auVar106._0_4_ = auVar100._0_4_ * auVar88._0_4_;
  auVar106._8_4_ = auVar100._8_4_ * auVar88._8_4_;
  auVar106._12_4_ = auVar100._12_4_ * auVar88._12_4_;
  auVar106._16_4_ = auVar100._16_4_ * 0.0;
  auVar106._20_4_ = auVar100._20_4_ * 0.0;
  auVar106._24_4_ = auVar100._24_4_ * 0.0;
  auVar106._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar217));
  auVar111._0_4_ = auVar88._0_4_ * auVar100._0_4_;
  auVar111._4_4_ = auVar88._4_4_ * auVar100._4_4_;
  auVar111._8_4_ = auVar88._8_4_ * auVar100._8_4_;
  auVar111._12_4_ = auVar88._12_4_ * auVar100._12_4_;
  auVar111._16_4_ = auVar100._16_4_ * 0.0;
  auVar111._20_4_ = auVar100._20_4_ * 0.0;
  auVar111._24_4_ = auVar100._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar104,auVar113);
  auVar98 = vpminsd_avx2(auVar105,auVar112);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98 = vpminsd_avx2(auVar106,auVar111);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar101._4_4_ = uVar166;
  auVar101._0_4_ = uVar166;
  auVar101._8_4_ = uVar166;
  auVar101._12_4_ = uVar166;
  auVar101._16_4_ = uVar166;
  auVar101._20_4_ = uVar166;
  auVar101._24_4_ = uVar166;
  auVar101._28_4_ = uVar166;
  auVar98 = vmaxps_avx512vl(auVar98,auVar101);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar100,auVar98);
  auVar100 = vpmaxsd_avx2(auVar104,auVar113);
  auVar98 = vpmaxsd_avx2(auVar105,auVar112);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar98 = vpmaxsd_avx2(auVar106,auVar111);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar102._4_4_ = uVar166;
  auVar102._0_4_ = uVar166;
  auVar102._8_4_ = uVar166;
  auVar102._12_4_ = uVar166;
  auVar102._16_4_ = uVar166;
  auVar102._20_4_ = uVar166;
  auVar102._24_4_ = uVar166;
  auVar102._28_4_ = uVar166;
  auVar98 = vminps_avx512vl(auVar98,auVar102);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar103._8_4_ = 0x3f800003;
  auVar103._0_8_ = 0x3f8000033f800003;
  auVar103._12_4_ = 0x3f800003;
  auVar103._16_4_ = 0x3f800003;
  auVar103._20_4_ = 0x3f800003;
  auVar103._24_4_ = 0x3f800003;
  auVar103._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar103);
  uVar15 = vpcmpgtd_avx512vl(auVar99,_DAT_01fe9900);
  uVar13 = vcmpps_avx512vl(local_300,auVar100,2);
  if ((byte)((byte)uVar13 & (byte)uVar15) == 0) {
    return;
  }
  local_5e8 = (ulong)(byte)((byte)uVar13 & (byte)uVar15);
  local_530 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5f0 = prim;
LAB_01d6aa46:
  lVar79 = 0;
  for (uVar75 = local_5e8; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar79 = lVar79 + 1;
  }
  uVar78 = *(uint *)(prim + 2);
  local_9d8 = (ulong)*(uint *)(prim + lVar79 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar78].ptr;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_9d8);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar79 = *(long *)&pGVar3[1].time_range.upper;
  auVar87 = *(undefined1 (*) [16])(lVar79 + (long)p_Var4 * uVar75);
  auVar94 = *(undefined1 (*) [16])(lVar79 + (uVar75 + 1) * (long)p_Var4);
  auVar88 = *(undefined1 (*) [16])(lVar79 + (uVar75 + 2) * (long)p_Var4);
  local_5e8 = local_5e8 - 1 & local_5e8;
  auVar93 = *(undefined1 (*) [16])(lVar79 + (uVar75 + 3) * (long)p_Var4);
  if (local_5e8 != 0) {
    uVar77 = local_5e8 - 1 & local_5e8;
    for (uVar75 = local_5e8; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar217 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar246._4_4_ = uVar166;
  auVar246._0_4_ = uVar166;
  auVar246._8_4_ = uVar166;
  auVar246._12_4_ = uVar166;
  local_420._16_4_ = uVar166;
  local_420._0_16_ = auVar246;
  local_420._20_4_ = uVar166;
  local_420._24_4_ = uVar166;
  local_420._28_4_ = uVar166;
  auVar250 = ZEXT3264(local_420);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar251._4_4_ = uVar166;
  auVar251._0_4_ = uVar166;
  auVar251._8_4_ = uVar166;
  auVar251._12_4_ = uVar166;
  local_440._16_4_ = uVar166;
  local_440._0_16_ = auVar251;
  local_440._20_4_ = uVar166;
  local_440._24_4_ = uVar166;
  local_440._28_4_ = uVar166;
  auVar85 = vunpcklps_avx(auVar246,auVar251);
  fVar235 = *(float *)(ray + k * 4 + 0x60);
  auVar252._4_4_ = fVar235;
  auVar252._0_4_ = fVar235;
  auVar252._8_4_ = fVar235;
  auVar252._12_4_ = fVar235;
  local_460._16_4_ = fVar235;
  local_460._0_16_ = auVar252;
  local_460._20_4_ = fVar235;
  local_460._24_4_ = fVar235;
  local_460._28_4_ = fVar235;
  local_6f0 = vinsertps_avx(auVar85,auVar252,0x28);
  auVar241 = ZEXT1664(local_6f0);
  auVar91._0_4_ = auVar87._0_4_ + auVar94._0_4_ + auVar88._0_4_ + auVar93._0_4_;
  auVar91._4_4_ = auVar87._4_4_ + auVar94._4_4_ + auVar88._4_4_ + auVar93._4_4_;
  auVar91._8_4_ = auVar87._8_4_ + auVar94._8_4_ + auVar88._8_4_ + auVar93._8_4_;
  auVar91._12_4_ = auVar87._12_4_ + auVar94._12_4_ + auVar88._12_4_ + auVar93._12_4_;
  auVar92._8_4_ = 0x3e800000;
  auVar92._0_8_ = 0x3e8000003e800000;
  auVar92._12_4_ = 0x3e800000;
  auVar85 = vmulps_avx512vl(auVar91,auVar92);
  auVar85 = vsubps_avx(auVar85,auVar217);
  auVar85 = vdpps_avx(auVar85,local_6f0,0x7f);
  fVar144 = *(float *)(ray + k * 4 + 0x30);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  auVar245 = ZEXT1664(local_700);
  auVar230._4_12_ = ZEXT812(0) << 0x20;
  auVar230._0_4_ = local_700._0_4_;
  auVar86 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar230);
  auVar89 = vfnmadd213ss_fma(auVar86,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar85._0_4_ * auVar86._0_4_ * auVar89._0_4_;
  auVar228 = ZEXT464((uint)local_2e0);
  auVar231._4_4_ = local_2e0;
  auVar231._0_4_ = local_2e0;
  auVar231._8_4_ = local_2e0;
  auVar231._12_4_ = local_2e0;
  fStack_6d0 = local_2e0;
  _local_6e0 = auVar231;
  fStack_6cc = local_2e0;
  fStack_6c8 = local_2e0;
  fStack_6c4 = local_2e0;
  auVar85 = vfmadd231ps_fma(auVar217,local_6f0,auVar231);
  auVar85 = vblendps_avx(auVar85,ZEXT816(0) << 0x40,8);
  auVar87 = vsubps_avx(auVar87,auVar85);
  auVar88 = vsubps_avx(auVar88,auVar85);
  auVar234 = ZEXT1664(auVar88);
  auVar94 = vsubps_avx(auVar94,auVar85);
  auVar237 = ZEXT1664(auVar94);
  auVar93 = vsubps_avx(auVar93,auVar85);
  local_8e0 = vbroadcastss_avx512vl(auVar87);
  auVar262 = ZEXT3264(local_8e0);
  auVar121._8_4_ = 1;
  auVar121._0_8_ = 0x100000001;
  auVar121._12_4_ = 1;
  auVar121._16_4_ = 1;
  auVar121._20_4_ = 1;
  auVar121._24_4_ = 1;
  auVar121._28_4_ = 1;
  local_660 = ZEXT1632(auVar87);
  local_900 = vpermps_avx512vl(auVar121,local_660);
  auVar254 = ZEXT3264(local_900);
  auVar124._8_4_ = 2;
  auVar124._0_8_ = 0x200000002;
  auVar124._12_4_ = 2;
  auVar124._16_4_ = 2;
  auVar124._20_4_ = 2;
  auVar124._24_4_ = 2;
  auVar124._28_4_ = 2;
  local_920 = vpermps_avx512vl(auVar124,local_660);
  auVar255 = ZEXT3264(local_920);
  auVar125._8_4_ = 3;
  auVar125._0_8_ = 0x300000003;
  auVar125._12_4_ = 3;
  auVar125._16_4_ = 3;
  auVar125._20_4_ = 3;
  auVar125._24_4_ = 3;
  auVar125._28_4_ = 3;
  local_940 = vpermps_avx512vl(auVar125,local_660);
  auVar256 = ZEXT3264(local_940);
  local_800 = vbroadcastss_avx512vl(auVar94);
  auVar257 = ZEXT3264(local_800);
  local_6a0 = ZEXT1632(auVar94);
  local_960 = vpermps_avx512vl(auVar121,local_6a0);
  auVar258 = ZEXT3264(local_960);
  local_820 = vpermps_avx512vl(auVar124,local_6a0);
  auVar259 = ZEXT3264(local_820);
  local_980 = vpermps_avx512vl(auVar125,local_6a0);
  auVar260 = ZEXT3264(local_980);
  local_840 = vbroadcastss_avx512vl(auVar88);
  auVar261 = ZEXT3264(local_840);
  local_680 = ZEXT1632(auVar88);
  local_9a0 = vpermps_avx512vl(auVar121,local_680);
  auVar263 = ZEXT3264(local_9a0);
  local_860 = vpermps_avx512vl(auVar124,local_680);
  auVar264 = ZEXT3264(local_860);
  local_9c0 = vpermps_avx512vl(auVar125,local_680);
  auVar266 = ZEXT3264(local_9c0);
  local_260 = vbroadcastss_avx512vl(auVar93);
  _local_6c0 = ZEXT1632(auVar93);
  local_240 = vpermps_avx512vl(auVar121,_local_6c0);
  local_2a0 = vpermps_avx2(auVar124,_local_6c0);
  local_2c0 = vpermps_avx2(auVar125,_local_6c0);
  auVar87 = vfmadd231ps_fma(ZEXT432((uint)(fVar235 * fVar235)),local_440,local_440);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_420,local_420);
  local_220._0_4_ = auVar87._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar120._8_4_ = 0x7fffffff;
  auVar120._0_8_ = 0x7fffffff7fffffff;
  auVar120._12_4_ = 0x7fffffff;
  auVar120._16_4_ = 0x7fffffff;
  auVar120._20_4_ = 0x7fffffff;
  auVar120._24_4_ = 0x7fffffff;
  auVar120._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar120);
  local_640 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar144 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_510 = vpbroadcastd_avx512vl();
  iVar76 = 1;
  uVar75 = 0;
  local_520 = vpbroadcastd_avx512vl();
  auVar87 = vsqrtss_avx(local_700,local_700);
  local_9c4 = auVar87._0_4_;
  auVar87 = vsqrtss_avx(local_700,local_700);
  local_9c8 = auVar87._0_4_;
  local_3b0 = ZEXT816(0x3f80000000000000);
  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar265 = ZEXT3264(auVar100);
  local_280 = local_240;
  do {
    auVar87 = vmovshdup_avx(local_3b0);
    auVar87 = vsubps_avx(auVar87,local_3b0);
    local_720._0_4_ = auVar87._0_4_;
    fVar226 = local_720._0_4_ * 0.04761905;
    uVar166 = local_3b0._0_4_;
    local_8c0._4_4_ = uVar166;
    local_8c0._0_4_ = uVar166;
    local_8c0._8_4_ = uVar166;
    local_8c0._12_4_ = uVar166;
    local_8c0._16_4_ = uVar166;
    local_8c0._20_4_ = uVar166;
    local_8c0._24_4_ = uVar166;
    local_8c0._28_4_ = uVar166;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    auVar87 = vfmadd231ps_fma(local_8c0,local_720,_DAT_01faff20);
    auVar98 = vsubps_avx512vl(auVar265._0_32_,ZEXT1632(auVar87));
    fVar235 = auVar98._0_4_;
    fVar239 = auVar98._4_4_;
    fVar213 = auVar98._8_4_;
    fVar215 = auVar98._12_4_;
    fVar216 = auVar98._16_4_;
    fVar224 = auVar98._20_4_;
    fVar225 = auVar98._24_4_;
    fVar145 = fVar235 * fVar235 * fVar235;
    fVar160 = fVar239 * fVar239 * fVar239;
    auVar35._4_4_ = fVar160;
    auVar35._0_4_ = fVar145;
    fVar161 = fVar213 * fVar213 * fVar213;
    auVar35._8_4_ = fVar161;
    fVar162 = fVar215 * fVar215 * fVar215;
    auVar35._12_4_ = fVar162;
    fVar163 = fVar216 * fVar216 * fVar216;
    auVar35._16_4_ = fVar163;
    fVar164 = fVar224 * fVar224 * fVar224;
    auVar35._20_4_ = fVar164;
    fVar165 = fVar225 * fVar225 * fVar225;
    auVar35._24_4_ = fVar165;
    auVar35._28_4_ = local_720._0_4_;
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar101 = vmulps_avx512vl(auVar35,auVar100);
    fVar238 = auVar87._0_4_;
    fVar240 = auVar87._4_4_;
    fVar214 = auVar87._8_4_;
    fVar207 = auVar87._12_4_;
    fVar182 = fVar238 * fVar238 * fVar238;
    fVar204 = fVar240 * fVar240 * fVar240;
    fVar205 = fVar214 * fVar214 * fVar214;
    fVar206 = fVar207 * fVar207 * fVar207;
    auVar71._28_4_ = DAT_01faff20._28_4_;
    auVar71._0_28_ = ZEXT1628(CONCAT412(fVar206,CONCAT48(fVar205,CONCAT44(fVar204,fVar182))));
    auVar242._0_4_ = fVar238 * fVar235;
    auVar242._4_4_ = fVar240 * fVar239;
    auVar242._8_4_ = fVar214 * fVar213;
    auVar242._12_4_ = fVar207 * fVar215;
    auVar242._16_4_ = fVar216 * 0.0;
    auVar242._20_4_ = fVar224 * 0.0;
    auVar242._28_36_ = auVar241._28_36_;
    auVar242._24_4_ = fVar225 * 0.0;
    auVar102 = vmulps_avx512vl(auVar71,auVar100);
    fVar244 = auVar102._28_4_ + local_720._0_4_;
    fVar227 = auVar245._28_4_;
    fVar229 = fVar244 + fVar227 + auVar228._28_4_;
    auVar36._4_4_ = fVar160 * 0.16666667;
    auVar36._0_4_ = fVar145 * 0.16666667;
    auVar36._8_4_ = fVar161 * 0.16666667;
    auVar36._12_4_ = fVar162 * 0.16666667;
    auVar36._16_4_ = fVar163 * 0.16666667;
    auVar36._20_4_ = fVar164 * 0.16666667;
    auVar36._24_4_ = fVar165 * 0.16666667;
    auVar36._28_4_ = fVar244;
    auVar37._4_4_ =
         (auVar242._4_4_ * fVar239 * 12.0 + auVar242._4_4_ * fVar240 * 6.0 +
         fVar204 + auVar101._4_4_) * 0.16666667;
    auVar37._0_4_ =
         (auVar242._0_4_ * fVar235 * 12.0 + auVar242._0_4_ * fVar238 * 6.0 +
         fVar182 + auVar101._0_4_) * 0.16666667;
    auVar37._8_4_ =
         (auVar242._8_4_ * fVar213 * 12.0 + auVar242._8_4_ * fVar214 * 6.0 +
         fVar205 + auVar101._8_4_) * 0.16666667;
    auVar37._12_4_ =
         (auVar242._12_4_ * fVar215 * 12.0 + auVar242._12_4_ * fVar207 * 6.0 +
         fVar206 + auVar101._12_4_) * 0.16666667;
    auVar37._16_4_ =
         (auVar242._16_4_ * fVar216 * 12.0 + auVar242._16_4_ * 0.0 * 6.0 + auVar101._16_4_ + 0.0) *
         0.16666667;
    auVar37._20_4_ =
         (auVar242._20_4_ * fVar224 * 12.0 + auVar242._20_4_ * 0.0 * 6.0 + auVar101._20_4_ + 0.0) *
         0.16666667;
    auVar37._24_4_ =
         (auVar242._24_4_ * fVar225 * 12.0 + auVar242._24_4_ * 0.0 * 6.0 + auVar101._24_4_ + 0.0) *
         0.16666667;
    auVar37._28_4_ = fVar227;
    auVar38._4_4_ =
         (auVar102._4_4_ + fVar160 +
         auVar242._4_4_ * fVar240 * 12.0 + auVar242._4_4_ * fVar239 * 6.0) * 0.16666667;
    auVar38._0_4_ =
         (auVar102._0_4_ + fVar145 +
         auVar242._0_4_ * fVar238 * 12.0 + auVar242._0_4_ * fVar235 * 6.0) * 0.16666667;
    auVar38._8_4_ =
         (auVar102._8_4_ + fVar161 +
         auVar242._8_4_ * fVar214 * 12.0 + auVar242._8_4_ * fVar213 * 6.0) * 0.16666667;
    auVar38._12_4_ =
         (auVar102._12_4_ + fVar162 +
         auVar242._12_4_ * fVar207 * 12.0 + auVar242._12_4_ * fVar215 * 6.0) * 0.16666667;
    auVar38._16_4_ =
         (auVar102._16_4_ + fVar163 + auVar242._16_4_ * 0.0 * 12.0 + auVar242._16_4_ * fVar216 * 6.0
         ) * 0.16666667;
    auVar38._20_4_ =
         (auVar102._20_4_ + fVar164 + auVar242._20_4_ * 0.0 * 12.0 + auVar242._20_4_ * fVar224 * 6.0
         ) * 0.16666667;
    auVar38._24_4_ =
         (auVar102._24_4_ + fVar165 + auVar242._24_4_ * 0.0 * 12.0 + auVar242._24_4_ * fVar225 * 6.0
         ) * 0.16666667;
    auVar38._28_4_ = auVar250._28_4_;
    fVar182 = fVar182 * 0.16666667;
    fVar204 = fVar204 * 0.16666667;
    fVar205 = fVar205 * 0.16666667;
    fVar206 = fVar206 * 0.16666667;
    auVar39._28_4_ = fVar229;
    auVar39._0_28_ = ZEXT1628(CONCAT412(fVar206,CONCAT48(fVar205,CONCAT44(fVar204,fVar182))));
    auVar101 = vmulps_avx512vl(local_260,auVar39);
    auVar102 = vmulps_avx512vl(local_280,auVar39);
    auVar40._4_4_ = local_2a0._4_4_ * fVar204;
    auVar40._0_4_ = local_2a0._0_4_ * fVar182;
    auVar40._8_4_ = local_2a0._8_4_ * fVar205;
    auVar40._12_4_ = local_2a0._12_4_ * fVar206;
    auVar40._16_4_ = local_2a0._16_4_ * 0.0;
    auVar40._20_4_ = local_2a0._20_4_ * 0.0;
    auVar40._24_4_ = local_2a0._24_4_ * 0.0;
    auVar40._28_4_ = local_720._0_4_;
    auVar41._4_4_ = local_2c0._4_4_ * fVar204;
    auVar41._0_4_ = local_2c0._0_4_ * fVar182;
    auVar41._8_4_ = local_2c0._8_4_ * fVar205;
    auVar41._12_4_ = local_2c0._12_4_ * fVar206;
    auVar41._16_4_ = local_2c0._16_4_ * 0.0;
    auVar41._20_4_ = local_2c0._20_4_ * 0.0;
    auVar41._24_4_ = local_2c0._24_4_ * 0.0;
    auVar41._28_4_ = fVar229;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar38,auVar261._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar38,auVar263._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar264._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar41,auVar266._0_32_,auVar38);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar37,auVar257._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar37,auVar258._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar37,auVar259._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar260._0_32_,auVar37);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar36,auVar262._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar36,auVar254._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar36,auVar255._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar99,auVar256._0_32_,auVar36);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar102 = vxorps_avx512vl(auVar98,auVar99);
    auVar103 = vxorps_avx512vl(ZEXT1632(auVar87),auVar99);
    auVar222._0_4_ = auVar103._0_4_ * fVar238;
    auVar222._4_4_ = auVar103._4_4_ * fVar240;
    auVar222._8_4_ = auVar103._8_4_ * fVar214;
    auVar222._12_4_ = auVar103._12_4_ * fVar207;
    auVar222._16_4_ = auVar103._16_4_ * 0.0;
    auVar222._20_4_ = auVar103._20_4_ * 0.0;
    auVar222._24_4_ = auVar103._24_4_ * 0.0;
    auVar222._28_4_ = 0;
    auVar103 = vmulps_avx512vl(auVar242._0_32_,auVar100);
    auVar100 = vsubps_avx(auVar222,auVar103);
    auVar42._4_4_ = auVar102._4_4_ * fVar239 * 0.5;
    auVar42._0_4_ = auVar102._0_4_ * fVar235 * 0.5;
    auVar42._8_4_ = auVar102._8_4_ * fVar213 * 0.5;
    auVar42._12_4_ = auVar102._12_4_ * fVar215 * 0.5;
    auVar42._16_4_ = auVar102._16_4_ * fVar216 * 0.5;
    auVar42._20_4_ = auVar102._20_4_ * fVar224 * 0.5;
    auVar42._24_4_ = auVar102._24_4_ * fVar225 * 0.5;
    auVar42._28_4_ = auVar98._28_4_;
    auVar43._4_4_ = auVar100._4_4_ * 0.5;
    auVar43._0_4_ = auVar100._0_4_ * 0.5;
    auVar43._8_4_ = auVar100._8_4_ * 0.5;
    auVar43._12_4_ = auVar100._12_4_ * 0.5;
    auVar43._16_4_ = auVar100._16_4_ * 0.5;
    auVar43._20_4_ = auVar100._20_4_ * 0.5;
    auVar43._24_4_ = auVar100._24_4_ * 0.5;
    auVar43._28_4_ = auVar100._28_4_;
    auVar44._4_4_ = (auVar103._4_4_ + fVar239 * fVar239) * 0.5;
    auVar44._0_4_ = (auVar103._0_4_ + fVar235 * fVar235) * 0.5;
    auVar44._8_4_ = (auVar103._8_4_ + fVar213 * fVar213) * 0.5;
    auVar44._12_4_ = (auVar103._12_4_ + fVar215 * fVar215) * 0.5;
    auVar44._16_4_ = (auVar103._16_4_ + fVar216 * fVar216) * 0.5;
    auVar44._20_4_ = (auVar103._20_4_ + fVar224 * fVar224) * 0.5;
    auVar44._24_4_ = (auVar103._24_4_ + fVar225 * fVar225) * 0.5;
    auVar44._28_4_ = auVar103._28_4_ + auVar234._28_4_;
    fVar235 = fVar238 * fVar238 * 0.5;
    fVar238 = fVar240 * fVar240 * 0.5;
    fVar239 = fVar214 * fVar214 * 0.5;
    fVar240 = fVar207 * fVar207 * 0.5;
    auVar45._28_4_ = auVar237._28_4_;
    auVar45._0_28_ = ZEXT1628(CONCAT412(fVar240,CONCAT48(fVar239,CONCAT44(fVar238,fVar235))));
    auVar100 = vmulps_avx512vl(local_260,auVar45);
    auVar98 = vmulps_avx512vl(local_280,auVar45);
    auVar46._4_4_ = local_2a0._4_4_ * fVar238;
    auVar46._0_4_ = local_2a0._0_4_ * fVar235;
    auVar46._8_4_ = local_2a0._8_4_ * fVar239;
    auVar46._12_4_ = local_2a0._12_4_ * fVar240;
    auVar46._16_4_ = local_2a0._16_4_ * 0.0;
    auVar46._20_4_ = local_2a0._20_4_ * 0.0;
    auVar46._24_4_ = local_2a0._24_4_ * 0.0;
    auVar46._28_4_ = fVar227;
    auVar47._4_4_ = fVar238 * local_2c0._4_4_;
    auVar47._0_4_ = fVar235 * local_2c0._0_4_;
    auVar47._8_4_ = fVar239 * local_2c0._8_4_;
    auVar47._12_4_ = fVar240 * local_2c0._12_4_;
    auVar47._16_4_ = local_2c0._16_4_ * 0.0;
    auVar47._20_4_ = local_2c0._20_4_ * 0.0;
    auVar47._24_4_ = local_2c0._24_4_ * 0.0;
    auVar47._28_4_ = auVar237._28_4_;
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar44,auVar261._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar44,auVar263._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar264._0_32_);
    auVar87 = vfmadd231ps_fma(auVar47,auVar266._0_32_,auVar44);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar43,auVar257._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar43,auVar258._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar43,auVar259._0_32_);
    auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar260._0_32_,auVar43);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar42,auVar262._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar42,auVar254._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar42,auVar255._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar256._0_32_,auVar42);
    auVar48._4_4_ = auVar100._4_4_ * fVar226;
    auVar48._0_4_ = auVar100._0_4_ * fVar226;
    auVar48._8_4_ = auVar100._8_4_ * fVar226;
    auVar48._12_4_ = auVar100._12_4_ * fVar226;
    auVar48._16_4_ = auVar100._16_4_ * fVar226;
    auVar48._20_4_ = auVar100._20_4_ * fVar226;
    auVar48._24_4_ = auVar100._24_4_ * fVar226;
    auVar48._28_4_ = auVar266._28_4_;
    auVar250 = ZEXT3264(auVar48);
    auVar49._4_4_ = auVar98._4_4_ * fVar226;
    auVar49._0_4_ = auVar98._0_4_ * fVar226;
    auVar49._8_4_ = auVar98._8_4_ * fVar226;
    auVar49._12_4_ = auVar98._12_4_ * fVar226;
    auVar49._16_4_ = auVar98._16_4_ * fVar226;
    auVar49._20_4_ = auVar98._20_4_ * fVar226;
    auVar49._24_4_ = auVar98._24_4_ * fVar226;
    auVar49._28_4_ = 0x3e2aaaab;
    auVar50._4_4_ = auVar102._4_4_ * fVar226;
    auVar50._0_4_ = auVar102._0_4_ * fVar226;
    auVar50._8_4_ = auVar102._8_4_ * fVar226;
    auVar50._12_4_ = auVar102._12_4_ * fVar226;
    auVar50._16_4_ = auVar102._16_4_ * fVar226;
    auVar50._20_4_ = auVar102._20_4_ * fVar226;
    auVar50._24_4_ = auVar102._24_4_ * fVar226;
    auVar50._28_4_ = 0x40c00000;
    fVar235 = auVar103._0_4_ * fVar226;
    fVar238 = auVar103._4_4_ * fVar226;
    auVar51._4_4_ = fVar238;
    auVar51._0_4_ = fVar235;
    fVar239 = auVar103._8_4_ * fVar226;
    auVar51._8_4_ = fVar239;
    fVar240 = auVar103._12_4_ * fVar226;
    auVar51._12_4_ = fVar240;
    fVar213 = auVar103._16_4_ * fVar226;
    auVar51._16_4_ = fVar213;
    fVar214 = auVar103._20_4_ * fVar226;
    auVar51._20_4_ = fVar214;
    fVar215 = auVar103._24_4_ * fVar226;
    auVar51._24_4_ = fVar215;
    auVar51._28_4_ = fVar226;
    auVar87 = vxorps_avx512vl(auVar265._0_16_,auVar265._0_16_);
    auVar107 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,ZEXT1632(auVar87));
    auVar241 = ZEXT3264(auVar107);
    auVar97 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar87));
    auVar102 = ZEXT1632(auVar87);
    auVar108 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar102);
    auVar245 = ZEXT3264(auVar108);
    auVar223._0_4_ = fVar235 + auVar101._0_4_;
    auVar223._4_4_ = fVar238 + auVar101._4_4_;
    auVar223._8_4_ = fVar239 + auVar101._8_4_;
    auVar223._12_4_ = fVar240 + auVar101._12_4_;
    auVar223._16_4_ = fVar213 + auVar101._16_4_;
    auVar223._20_4_ = fVar214 + auVar101._20_4_;
    auVar223._24_4_ = fVar215 + auVar101._24_4_;
    auVar223._28_4_ = fVar226 + auVar101._28_4_;
    auVar100 = vmaxps_avx(auVar101,auVar223);
    auVar98 = vminps_avx(auVar101,auVar223);
    auVar109 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar102);
    auVar95 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar102);
    auVar237 = ZEXT3264(auVar95);
    auVar96 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar102);
    auVar124 = ZEXT1632(auVar87);
    auVar110 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar124);
    auVar101 = vpermt2ps_avx512vl(auVar51,_DAT_01feed00,auVar124);
    auVar111 = vsubps_avx512vl(auVar109,auVar101);
    auVar101 = vsubps_avx(auVar107,auVar104);
    auVar234 = ZEXT3264(auVar101);
    auVar102 = vsubps_avx(auVar97,auVar105);
    auVar103 = vsubps_avx(auVar108,auVar106);
    auVar228 = ZEXT3264(auVar103);
    auVar112 = vmulps_avx512vl(auVar102,auVar50);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar49,auVar103);
    auVar113 = vmulps_avx512vl(auVar103,auVar48);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar50,auVar101);
    auVar114 = vmulps_avx512vl(auVar101,auVar49);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar48,auVar102);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar113 = vmulps_avx512vl(auVar103,auVar103);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,auVar102);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar101,auVar101);
    auVar114 = vrcp14ps_avx512vl(auVar113);
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar116 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar115);
    auVar114 = vfmadd132ps_avx512vl(auVar116,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar112,auVar114);
    auVar116 = vmulps_avx512vl(auVar102,auVar110);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar96,auVar103);
    auVar117 = vmulps_avx512vl(auVar103,auVar95);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar110,auVar101);
    auVar118 = vmulps_avx512vl(auVar101,auVar96);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar95,auVar102);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar116,auVar114);
    auVar112 = vmaxps_avx512vl(auVar112,auVar114);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar114 = vmaxps_avx512vl(auVar111,auVar109);
    auVar100 = vmaxps_avx512vl(auVar100,auVar114);
    auVar114 = vaddps_avx512vl(auVar112,auVar100);
    auVar100 = vminps_avx512vl(auVar111,auVar109);
    auVar100 = vminps_avx(auVar98,auVar100);
    auVar100 = vsubps_avx512vl(auVar100,auVar112);
    auVar212._8_4_ = 0x3f800002;
    auVar212._0_8_ = 0x3f8000023f800002;
    auVar212._12_4_ = 0x3f800002;
    auVar212._16_4_ = 0x3f800002;
    auVar212._20_4_ = 0x3f800002;
    auVar212._24_4_ = 0x3f800002;
    auVar212._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar114,auVar212);
    auVar24._8_4_ = 0x3f7ffffc;
    auVar24._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar24._12_4_ = 0x3f7ffffc;
    auVar24._16_4_ = 0x3f7ffffc;
    auVar24._20_4_ = 0x3f7ffffc;
    auVar24._24_4_ = 0x3f7ffffc;
    auVar24._28_4_ = 0x3f7ffffc;
    auVar100 = vmulps_avx512vl(auVar100,auVar24);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar109 = vrsqrt14ps_avx512vl(auVar113);
    auVar25._8_4_ = 0xbf000000;
    auVar25._0_8_ = 0xbf000000bf000000;
    auVar25._12_4_ = 0xbf000000;
    auVar25._16_4_ = 0xbf000000;
    auVar25._20_4_ = 0xbf000000;
    auVar25._24_4_ = 0xbf000000;
    auVar25._28_4_ = 0xbf000000;
    auVar111 = vmulps_avx512vl(auVar113,auVar25);
    fVar235 = auVar109._0_4_;
    fVar238 = auVar109._4_4_;
    fVar239 = auVar109._8_4_;
    fVar240 = auVar109._12_4_;
    fVar213 = auVar109._16_4_;
    fVar214 = auVar109._20_4_;
    fVar215 = auVar109._24_4_;
    auVar52._4_4_ = fVar238 * fVar238 * fVar238 * auVar111._4_4_;
    auVar52._0_4_ = fVar235 * fVar235 * fVar235 * auVar111._0_4_;
    auVar52._8_4_ = fVar239 * fVar239 * fVar239 * auVar111._8_4_;
    auVar52._12_4_ = fVar240 * fVar240 * fVar240 * auVar111._12_4_;
    auVar52._16_4_ = fVar213 * fVar213 * fVar213 * auVar111._16_4_;
    auVar52._20_4_ = fVar214 * fVar214 * fVar214 * auVar111._20_4_;
    auVar52._24_4_ = fVar215 * fVar215 * fVar215 * auVar111._24_4_;
    auVar52._28_4_ = auVar114._28_4_;
    auVar26._8_4_ = 0x3fc00000;
    auVar26._0_8_ = 0x3fc000003fc00000;
    auVar26._12_4_ = 0x3fc00000;
    auVar26._16_4_ = 0x3fc00000;
    auVar26._20_4_ = 0x3fc00000;
    auVar26._24_4_ = 0x3fc00000;
    auVar26._28_4_ = 0x3fc00000;
    auVar109 = vfmadd231ps_avx512vl(auVar52,auVar109,auVar26);
    auVar111 = vmulps_avx512vl(auVar101,auVar109);
    auVar112 = vmulps_avx512vl(auVar102,auVar109);
    auVar113 = vmulps_avx512vl(auVar103,auVar109);
    auVar114 = vsubps_avx512vl(auVar124,auVar104);
    auVar116 = vsubps_avx512vl(auVar124,auVar105);
    auVar117 = vsubps_avx512vl(auVar124,auVar106);
    auVar118 = vmulps_avx512vl(local_460,auVar117);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_440,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_420,auVar114);
    auVar119 = vmulps_avx512vl(auVar117,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar116);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar114,auVar114);
    auVar120 = vmulps_avx512vl(local_460,auVar113);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar112,local_440);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar111,local_420);
    auVar113 = vmulps_avx512vl(auVar117,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar116,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar111);
    auVar112 = vmulps_avx512vl(auVar120,auVar120);
    auVar113 = vsubps_avx512vl(local_220,auVar112);
    auVar121 = vmulps_avx512vl(auVar120,auVar111);
    auVar118 = vsubps_avx512vl(auVar118,auVar121);
    auVar118 = vaddps_avx512vl(auVar118,auVar118);
    auVar121 = vmulps_avx512vl(auVar111,auVar111);
    local_740 = vsubps_avx512vl(auVar119,auVar121);
    auVar98 = vsubps_avx512vl(local_740,auVar98);
    local_7a0 = vmulps_avx512vl(auVar118,auVar118);
    auVar27._8_4_ = 0x40800000;
    auVar27._0_8_ = 0x4080000040800000;
    auVar27._12_4_ = 0x40800000;
    auVar27._16_4_ = 0x40800000;
    auVar27._20_4_ = 0x40800000;
    auVar27._24_4_ = 0x40800000;
    auVar27._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar113,auVar27);
    auVar119 = vmulps_avx512vl(_local_7c0,auVar98);
    auVar119 = vsubps_avx512vl(local_7a0,auVar119);
    uVar77 = vcmpps_avx512vl(auVar119,auVar124,5);
    bVar72 = (byte)uVar77;
    fVar235 = (float)local_6e0._0_4_;
    fVar238 = (float)local_6e0._4_4_;
    fVar239 = fStack_6d8;
    fVar240 = fStack_6d4;
    fVar213 = fStack_6d0;
    fVar214 = fStack_6cc;
    fVar215 = fStack_6c8;
    fVar207 = fStack_6c4;
    if (bVar72 == 0) {
      auVar265 = ZEXT3264(auVar115);
LAB_01d6b76b:
      auVar262 = ZEXT3264(local_8e0);
      auVar254 = ZEXT3264(local_900);
      auVar255 = ZEXT3264(local_920);
      auVar256 = ZEXT3264(local_940);
      auVar257 = ZEXT3264(local_800);
      auVar258 = ZEXT3264(local_960);
      auVar259 = ZEXT3264(local_820);
      auVar260 = ZEXT3264(local_980);
      auVar261 = ZEXT3264(local_840);
      auVar263 = ZEXT3264(local_9a0);
      auVar264 = ZEXT3264(local_860);
      auVar266 = ZEXT3264(local_9c0);
    }
    else {
      auVar119 = vsqrtps_avx512vl(auVar119);
      auVar121 = vaddps_avx512vl(auVar113,auVar113);
      local_560 = vrcp14ps_avx512vl(auVar121);
      auVar115 = vfnmadd213ps_avx512vl(local_560,auVar121,auVar115);
      auVar115 = vfmadd132ps_avx512vl(auVar115,local_560,local_560);
      local_7e0 = vxorps_avx512vl(auVar118,auVar99);
      auVar99 = vsubps_avx512vl(local_7e0,auVar119);
      auVar99 = vmulps_avx512vl(auVar99,auVar115);
      auVar119 = vsubps_avx512vl(auVar119,auVar118);
      _local_580 = vmulps_avx512vl(auVar119,auVar115);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar115,auVar99);
      auVar122._0_4_ =
           (uint)(bVar72 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar115._0_4_;
      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar5 * auVar119._4_4_ | (uint)!bVar5 * auVar115._4_4_;
      bVar5 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar5 * auVar119._8_4_ | (uint)!bVar5 * auVar115._8_4_;
      bVar5 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar5 * auVar119._12_4_ | (uint)!bVar5 * auVar115._12_4_;
      bVar5 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar5 * auVar119._16_4_ | (uint)!bVar5 * auVar115._16_4_;
      bVar5 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar5 * auVar119._20_4_ | (uint)!bVar5 * auVar115._20_4_;
      bVar5 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar5 * auVar119._24_4_ | (uint)!bVar5 * auVar115._24_4_;
      bVar5 = SUB81(uVar77 >> 7,0);
      auVar122._28_4_ = (uint)bVar5 * auVar119._28_4_ | (uint)!bVar5 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar115,_local_580);
      auVar123._0_4_ =
           (uint)(bVar72 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar115._0_4_;
      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar5 * auVar119._4_4_ | (uint)!bVar5 * auVar115._4_4_;
      bVar5 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar5 * auVar119._8_4_ | (uint)!bVar5 * auVar115._8_4_;
      bVar5 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar5 * auVar119._12_4_ | (uint)!bVar5 * auVar115._12_4_;
      bVar5 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar5 * auVar119._16_4_ | (uint)!bVar5 * auVar115._16_4_;
      bVar5 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar5 * auVar119._20_4_ | (uint)!bVar5 * auVar115._20_4_;
      bVar5 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar5 * auVar119._24_4_ | (uint)!bVar5 * auVar115._24_4_;
      bVar5 = SUB81(uVar77 >> 7,0);
      auVar123._28_4_ = (uint)bVar5 * auVar119._28_4_ | (uint)!bVar5 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar115);
      local_5a0 = vmaxps_avx512vl(local_240,auVar115);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      local_5c0 = vmulps_avx512vl(local_5a0,auVar28);
      vandps_avx512vl(auVar113,auVar115);
      uVar82 = vcmpps_avx512vl(local_5c0,local_5c0,1);
      uVar77 = uVar77 & uVar82;
      bVar74 = (byte)uVar77;
      if (bVar74 != 0) {
        uVar82 = vcmpps_avx512vl(auVar98,_DAT_01faff00,2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar113 = vblendmps_avx512vl(auVar98,auVar112);
        bVar80 = (byte)uVar82;
        uVar84 = (uint)(bVar80 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar80 & 1) * local_5c0._0_4_;
        bVar5 = (bool)((byte)(uVar82 >> 1) & 1);
        uVar83 = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * local_5c0._4_4_;
        bVar5 = (bool)((byte)(uVar82 >> 2) & 1);
        uVar137 = (uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * local_5c0._8_4_;
        bVar5 = (bool)((byte)(uVar82 >> 3) & 1);
        uVar138 = (uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * local_5c0._12_4_;
        bVar5 = (bool)((byte)(uVar82 >> 4) & 1);
        uVar139 = (uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * local_5c0._16_4_;
        bVar5 = (bool)((byte)(uVar82 >> 5) & 1);
        uVar140 = (uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * local_5c0._20_4_;
        bVar5 = (bool)((byte)(uVar82 >> 6) & 1);
        uVar141 = (uint)bVar5 * auVar113._24_4_ | (uint)!bVar5 * local_5c0._24_4_;
        bVar5 = SUB81(uVar82 >> 7,0);
        uVar142 = (uint)bVar5 * auVar113._28_4_ | (uint)!bVar5 * local_5c0._28_4_;
        auVar122._0_4_ = (bVar74 & 1) * uVar84 | !(bool)(bVar74 & 1) * auVar122._0_4_;
        bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar122._4_4_ = bVar5 * uVar83 | !bVar5 * auVar122._4_4_;
        bVar5 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar122._8_4_ = bVar5 * uVar137 | !bVar5 * auVar122._8_4_;
        bVar5 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar122._12_4_ = bVar5 * uVar138 | !bVar5 * auVar122._12_4_;
        bVar5 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar122._16_4_ = bVar5 * uVar139 | !bVar5 * auVar122._16_4_;
        bVar5 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar122._20_4_ = bVar5 * uVar140 | !bVar5 * auVar122._20_4_;
        bVar5 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar122._24_4_ = bVar5 * uVar141 | !bVar5 * auVar122._24_4_;
        bVar5 = SUB81(uVar77 >> 7,0);
        auVar122._28_4_ = bVar5 * uVar142 | !bVar5 * auVar122._28_4_;
        auVar98 = vblendmps_avx512vl(auVar112,auVar98);
        bVar5 = (bool)((byte)(uVar82 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar82 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar82 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar82 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
        bVar12 = SUB81(uVar82 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar80 & 1) * auVar98._0_4_ | !(bool)(bVar80 & 1) * uVar84) |
             !(bool)(bVar74 & 1) * auVar123._0_4_;
        bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar6 * ((uint)bVar5 * auVar98._4_4_ | !bVar5 * uVar83) | !bVar6 * auVar123._4_4_
        ;
        bVar5 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar5 * ((uint)bVar7 * auVar98._8_4_ | !bVar7 * uVar137) |
             !bVar5 * auVar123._8_4_;
        bVar5 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar5 * ((uint)bVar8 * auVar98._12_4_ | !bVar8 * uVar138) |
             !bVar5 * auVar123._12_4_;
        bVar5 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar5 * ((uint)bVar9 * auVar98._16_4_ | !bVar9 * uVar139) |
             !bVar5 * auVar123._16_4_;
        bVar5 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar5 * ((uint)bVar10 * auVar98._20_4_ | !bVar10 * uVar140) |
             !bVar5 * auVar123._20_4_;
        bVar5 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar5 * ((uint)bVar11 * auVar98._24_4_ | !bVar11 * uVar141) |
             !bVar5 * auVar123._24_4_;
        bVar5 = SUB81(uVar77 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar5 * ((uint)bVar12 * auVar98._28_4_ | !bVar12 * uVar142) |
             !bVar5 * auVar123._28_4_;
        bVar72 = (~bVar74 | bVar80) & bVar72;
      }
      if ((bVar72 & 0x7f) == 0) {
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar265 = ZEXT3264(auVar100);
        goto LAB_01d6b76b;
      }
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar110 = vxorps_avx512vl(auVar110,auVar98);
      auVar95 = vxorps_avx512vl(auVar95,auVar98);
      uVar84 = *(uint *)(ray + k * 4 + 0x80);
      auVar96 = vxorps_avx512vl(auVar96,auVar98);
      local_750 = ZEXT416(uVar84);
      auVar87 = vsubss_avx512f(local_750,ZEXT416((uint)local_640._0_4_));
      auVar112 = vbroadcastss_avx512vl(auVar87);
      auVar112 = vminps_avx512vl(auVar112,auVar123);
      auVar70._4_4_ = fStack_2dc;
      auVar70._0_4_ = local_2e0;
      auVar70._8_4_ = fStack_2d8;
      auVar70._12_4_ = fStack_2d4;
      auVar70._16_4_ = fStack_2d0;
      auVar70._20_4_ = fStack_2cc;
      auVar70._24_4_ = fStack_2c8;
      auVar70._28_4_ = fStack_2c4;
      auVar113 = vmaxps_avx512vl(auVar70,auVar122);
      auVar115 = vmulps_avx512vl(auVar50,auVar117);
      auVar115 = vfmadd213ps_avx512vl(auVar116,auVar49,auVar115);
      auVar87 = vfmadd213ps_fma(auVar114,auVar48,auVar115);
      auVar114 = vmulps_avx512vl(local_460,auVar50);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_440,auVar49);
      auVar94 = vfmadd231ps_fma(auVar114,local_420,auVar48);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar94),auVar114);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar13 = vcmpps_avx512vl(auVar114,auVar115,1);
      auVar116 = vxorps_avx512vl(ZEXT1632(auVar87),auVar98);
      auVar117 = vrcp14ps_avx512vl(ZEXT1632(auVar94));
      auVar212 = ZEXT1632(auVar94);
      auVar119 = vxorps_avx512vl(auVar212,auVar98);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar125 = vfnmadd213ps_avx512vl(auVar117,auVar212,auVar124);
      auVar87 = vfmadd132ps_fma(auVar125,auVar117,auVar117);
      fVar216 = auVar87._0_4_ * auVar116._0_4_;
      fVar224 = auVar87._4_4_ * auVar116._4_4_;
      auVar53._4_4_ = fVar224;
      auVar53._0_4_ = fVar216;
      fVar225 = auVar87._8_4_ * auVar116._8_4_;
      auVar53._8_4_ = fVar225;
      fVar226 = auVar87._12_4_ * auVar116._12_4_;
      auVar53._12_4_ = fVar226;
      fVar227 = auVar116._16_4_ * 0.0;
      auVar53._16_4_ = fVar227;
      fVar145 = auVar116._20_4_ * 0.0;
      auVar53._20_4_ = fVar145;
      fVar160 = auVar116._24_4_ * 0.0;
      auVar53._24_4_ = fVar160;
      auVar53._28_4_ = auVar116._28_4_;
      uVar15 = vcmpps_avx512vl(auVar212,auVar119,1);
      bVar74 = (byte)uVar13 | (byte)uVar15;
      auVar249._8_4_ = 0xff800000;
      auVar249._0_8_ = 0xff800000ff800000;
      auVar249._12_4_ = 0xff800000;
      auVar249._16_4_ = 0xff800000;
      auVar249._20_4_ = 0xff800000;
      auVar249._24_4_ = 0xff800000;
      auVar249._28_4_ = 0xff800000;
      auVar117 = vblendmps_avx512vl(auVar53,auVar249);
      auVar126._0_4_ = (uint)(bVar74 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar74 & 1) * -0x800000;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar5 * auVar117._4_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar5 * auVar117._8_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar5 * auVar117._12_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar5 * auVar117._16_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar5 * auVar117._20_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar5 * auVar117._24_4_ | (uint)!bVar5 * -0x800000;
      auVar126._28_4_ =
           (uint)(bVar74 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar74 >> 7) * -0x800000;
      auVar117 = vmaxps_avx512vl(auVar113,auVar126);
      auVar250 = ZEXT3264(auVar117);
      uVar15 = vcmpps_avx512vl(auVar212,auVar119,6);
      bVar74 = (byte)uVar13 | (byte)uVar15;
      auVar127._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * (int)fVar216;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar224;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar225;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar226;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar227;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar145;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar160;
      auVar127._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar116._28_4_;
      auVar112 = vminps_avx512vl(auVar112,auVar127);
      auVar87 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
      auVar107 = vsubps_avx512vl(ZEXT1632(auVar87),auVar107);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar87),auVar97);
      auVar113 = ZEXT1632(auVar87);
      auVar108 = vsubps_avx512vl(auVar113,auVar108);
      auVar108 = vmulps_avx512vl(auVar108,auVar110);
      auVar97 = vfmadd231ps_avx512vl(auVar108,auVar96,auVar97);
      auVar107 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar107);
      auVar97 = vmulps_avx512vl(local_460,auVar110);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_440,auVar96);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_420,auVar95);
      vandps_avx512vl(auVar97,auVar114);
      uVar13 = vcmpps_avx512vl(auVar97,auVar115,1);
      auVar107 = vxorps_avx512vl(auVar107,auVar98);
      auVar108 = vrcp14ps_avx512vl(auVar97);
      auVar98 = vxorps_avx512vl(auVar97,auVar98);
      auVar245 = ZEXT3264(auVar98);
      auVar95 = vfnmadd213ps_avx512vl(auVar108,auVar97,auVar124);
      auVar87 = vfmadd132ps_fma(auVar95,auVar108,auVar108);
      fVar216 = auVar87._0_4_ * auVar107._0_4_;
      fVar224 = auVar87._4_4_ * auVar107._4_4_;
      auVar54._4_4_ = fVar224;
      auVar54._0_4_ = fVar216;
      fVar225 = auVar87._8_4_ * auVar107._8_4_;
      auVar54._8_4_ = fVar225;
      fVar226 = auVar87._12_4_ * auVar107._12_4_;
      auVar54._12_4_ = fVar226;
      fVar227 = auVar107._16_4_ * 0.0;
      auVar54._16_4_ = fVar227;
      fVar145 = auVar107._20_4_ * 0.0;
      auVar54._20_4_ = fVar145;
      fVar160 = auVar107._24_4_ * 0.0;
      auVar54._24_4_ = fVar160;
      auVar54._28_4_ = auVar107._28_4_;
      uVar15 = vcmpps_avx512vl(auVar97,auVar98,1);
      bVar74 = (byte)uVar13 | (byte)uVar15;
      auVar29._8_4_ = 0xff800000;
      auVar29._0_8_ = 0xff800000ff800000;
      auVar29._12_4_ = 0xff800000;
      auVar29._16_4_ = 0xff800000;
      auVar29._20_4_ = 0xff800000;
      auVar29._24_4_ = 0xff800000;
      auVar29._28_4_ = 0xff800000;
      auVar95 = vblendmps_avx512vl(auVar54,auVar29);
      auVar128._0_4_ =
           (uint)(bVar74 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar108._0_4_;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar5 * auVar95._4_4_ | (uint)!bVar5 * auVar108._4_4_;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar5 * auVar95._8_4_ | (uint)!bVar5 * auVar108._8_4_;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar5 * auVar95._12_4_ | (uint)!bVar5 * auVar108._12_4_;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar5 * auVar95._16_4_ | (uint)!bVar5 * auVar108._16_4_;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar5 * auVar95._20_4_ | (uint)!bVar5 * auVar108._20_4_;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar5 * auVar95._24_4_ | (uint)!bVar5 * auVar108._24_4_;
      auVar128._28_4_ =
           (uint)(bVar74 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar108._28_4_;
      _local_5e0 = vmaxps_avx(auVar117,auVar128);
      auVar237 = ZEXT3264(_local_5e0);
      uVar15 = vcmpps_avx512vl(auVar97,auVar98,6);
      bVar74 = (byte)uVar13 | (byte)uVar15;
      auVar129._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * (int)fVar216;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar224;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar225;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar226;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar227;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar145;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar160;
      auVar129._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar107._28_4_;
      local_360 = vminps_avx(auVar112,auVar129);
      auVar241 = ZEXT3264(local_360);
      uVar13 = vcmpps_avx512vl(_local_5e0,local_360,2);
      bVar72 = bVar72 & 0x7f & (byte)uVar13;
      if (bVar72 == 0) {
        auVar265 = ZEXT3264(auVar124);
        goto LAB_01d6b76b;
      }
      auVar98 = vmaxps_avx512vl(auVar113,auVar100);
      auVar100 = vfmadd213ps_avx512vl(auVar99,auVar120,auVar111);
      auVar100 = vmulps_avx512vl(auVar109,auVar100);
      auVar99 = vfmadd213ps_avx512vl(_local_580,auVar120,auVar111);
      auVar55._4_4_ = auVar109._4_4_ * auVar99._4_4_;
      auVar55._0_4_ = auVar109._0_4_ * auVar99._0_4_;
      auVar55._8_4_ = auVar109._8_4_ * auVar99._8_4_;
      auVar55._12_4_ = auVar109._12_4_ * auVar99._12_4_;
      auVar55._16_4_ = auVar109._16_4_ * auVar99._16_4_;
      auVar55._20_4_ = auVar109._20_4_ * auVar99._20_4_;
      auVar55._24_4_ = auVar109._24_4_ * auVar99._24_4_;
      auVar55._28_4_ = auVar128._28_4_;
      auVar100 = vminps_avx512vl(auVar100,auVar124);
      auVar62 = ZEXT812(0);
      auVar99 = ZEXT1232(auVar62) << 0x20;
      auVar100 = vmaxps_avx(auVar100,ZEXT1232(auVar62) << 0x20);
      auVar107 = vminps_avx512vl(auVar55,auVar124);
      auVar56._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar100._28_4_ + 7.0;
      auVar87 = vfmadd213ps_fma(auVar56,local_720,local_8c0);
      local_1a0 = ZEXT1632(auVar87);
      auVar100 = vmaxps_avx(auVar107,ZEXT1232(auVar62) << 0x20);
      auVar57._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar57._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar57._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar57._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar57._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar57._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar57._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar57._28_4_ = auVar100._28_4_ + 7.0;
      auVar87 = vfmadd213ps_fma(auVar57,local_720,local_8c0);
      local_1c0 = ZEXT1632(auVar87);
      auVar58._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar58._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar58._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar58._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar58._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar58._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar58._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar58._28_4_ = auVar98._28_4_;
      auVar100 = vsubps_avx(local_740,auVar58);
      auVar59._4_4_ = auVar100._4_4_ * (float)local_7c0._4_4_;
      auVar59._0_4_ = auVar100._0_4_ * (float)local_7c0._0_4_;
      auVar59._8_4_ = auVar100._8_4_ * fStack_7b8;
      auVar59._12_4_ = auVar100._12_4_ * fStack_7b4;
      auVar59._16_4_ = auVar100._16_4_ * fStack_7b0;
      auVar59._20_4_ = auVar100._20_4_ * fStack_7ac;
      auVar59._24_4_ = auVar100._24_4_ * fStack_7a8;
      auVar59._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(local_7a0,auVar59);
      uVar77 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar62) << 0x20,5);
      auVar261 = ZEXT3264(local_840);
      auVar264 = ZEXT3264(local_860);
      if ((byte)uVar77 == 0) {
        uVar77 = 0;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar228 = ZEXT864(0) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar243 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar130._8_4_ = 0x7f800000;
        auVar130._0_8_ = 0x7f8000007f800000;
        auVar130._12_4_ = 0x7f800000;
        auVar130._16_4_ = 0x7f800000;
        auVar130._20_4_ = 0x7f800000;
        auVar130._24_4_ = 0x7f800000;
        auVar130._28_4_ = 0x7f800000;
        auVar131._8_4_ = 0xff800000;
        auVar131._0_8_ = 0xff800000ff800000;
        auVar131._12_4_ = 0xff800000;
        auVar131._16_4_ = 0xff800000;
        auVar131._20_4_ = 0xff800000;
        auVar131._24_4_ = 0xff800000;
        auVar131._28_4_ = 0xff800000;
      }
      else {
        uVar82 = vcmpps_avx512vl(auVar98,auVar113,5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar99 = vfnmadd213ps_avx512vl(auVar121,local_560,auVar124);
        auVar97 = vfmadd132ps_avx512vl(auVar99,local_560,local_560);
        auVar99 = vsubps_avx(local_7e0,auVar98);
        auVar108 = vmulps_avx512vl(auVar99,auVar97);
        auVar98 = vsubps_avx512vl(auVar98,auVar118);
        auVar97 = vmulps_avx512vl(auVar98,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar120,auVar108,auVar111);
        auVar60._4_4_ = auVar109._4_4_ * auVar98._4_4_;
        auVar60._0_4_ = auVar109._0_4_ * auVar98._0_4_;
        auVar60._8_4_ = auVar109._8_4_ * auVar98._8_4_;
        auVar60._12_4_ = auVar109._12_4_ * auVar98._12_4_;
        auVar60._16_4_ = auVar109._16_4_ * auVar98._16_4_;
        auVar60._20_4_ = auVar109._20_4_ * auVar98._20_4_;
        auVar60._24_4_ = auVar109._24_4_ * auVar98._24_4_;
        auVar60._28_4_ = auVar107._28_4_;
        auVar98 = vmulps_avx512vl(local_420,auVar108);
        auVar99 = vmulps_avx512vl(local_440,auVar108);
        auVar95 = vmulps_avx512vl(local_460,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar101,auVar60,auVar104);
        auVar98 = vsubps_avx512vl(auVar98,auVar107);
        auVar107 = vfmadd213ps_avx512vl(auVar102,auVar60,auVar105);
        auVar107 = vsubps_avx512vl(auVar99,auVar107);
        auVar87 = vfmadd213ps_fma(auVar60,auVar103,auVar106);
        auVar99 = vsubps_avx(auVar95,ZEXT1632(auVar87));
        auVar243 = auVar99._0_28_;
        auVar99 = vfmadd213ps_avx512vl(auVar120,auVar97,auVar111);
        auVar109 = vmulps_avx512vl(auVar109,auVar99);
        auVar99 = vmulps_avx512vl(local_420,auVar97);
        auVar95 = vmulps_avx512vl(local_440,auVar97);
        auVar96 = vmulps_avx512vl(local_460,auVar97);
        auVar87 = vfmadd213ps_fma(auVar101,auVar109,auVar104);
        auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar102,auVar109,auVar105);
        auVar101 = vsubps_avx512vl(auVar95,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar103,auVar109,auVar106);
        auVar102 = vsubps_avx512vl(auVar96,ZEXT1632(auVar87));
        auVar228 = ZEXT3264(auVar102);
        auVar152._8_4_ = 0x7f800000;
        auVar152._0_8_ = 0x7f8000007f800000;
        auVar152._12_4_ = 0x7f800000;
        auVar152._16_4_ = 0x7f800000;
        auVar152._20_4_ = 0x7f800000;
        auVar152._24_4_ = 0x7f800000;
        auVar152._28_4_ = 0x7f800000;
        auVar102 = vblendmps_avx512vl(auVar152,auVar108);
        bVar5 = (bool)((byte)uVar82 & 1);
        auVar130._0_4_ = (uint)bVar5 * auVar102._0_4_ | (uint)!bVar5 * auVar104._0_4_;
        bVar5 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar5 * auVar102._4_4_ | (uint)!bVar5 * auVar104._4_4_;
        bVar5 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar5 * auVar102._8_4_ | (uint)!bVar5 * auVar104._8_4_;
        bVar5 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar5 * auVar102._12_4_ | (uint)!bVar5 * auVar104._12_4_;
        bVar5 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar5 * auVar102._16_4_ | (uint)!bVar5 * auVar104._16_4_;
        bVar5 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar5 * auVar102._20_4_ | (uint)!bVar5 * auVar104._20_4_;
        bVar5 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar5 * auVar102._24_4_ | (uint)!bVar5 * auVar104._24_4_;
        bVar5 = SUB81(uVar82 >> 7,0);
        auVar130._28_4_ = (uint)bVar5 * auVar102._28_4_ | (uint)!bVar5 * auVar104._28_4_;
        auVar153._8_4_ = 0xff800000;
        auVar153._0_8_ = 0xff800000ff800000;
        auVar153._12_4_ = 0xff800000;
        auVar153._16_4_ = 0xff800000;
        auVar153._20_4_ = 0xff800000;
        auVar153._24_4_ = 0xff800000;
        auVar153._28_4_ = 0xff800000;
        auVar102 = vblendmps_avx512vl(auVar153,auVar97);
        bVar5 = (bool)((byte)uVar82 & 1);
        auVar131._0_4_ = (uint)bVar5 * auVar102._0_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar5 * auVar102._4_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar5 * auVar102._8_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar5 * auVar102._12_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar5 * auVar102._16_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar5 * auVar102._20_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar5 * auVar102._24_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = SUB81(uVar82 >> 7,0);
        auVar131._28_4_ = (uint)bVar5 * auVar102._28_4_ | (uint)!bVar5 * -0x800000;
        auVar30._8_4_ = 0x36000000;
        auVar30._0_8_ = 0x3600000036000000;
        auVar30._12_4_ = 0x36000000;
        auVar30._16_4_ = 0x36000000;
        auVar30._20_4_ = 0x36000000;
        auVar30._24_4_ = 0x36000000;
        auVar30._28_4_ = 0x36000000;
        auVar102 = vmulps_avx512vl(local_5a0,auVar30);
        uVar14 = vcmpps_avx512vl(auVar102,local_5c0,0xe);
        uVar82 = uVar82 & uVar14;
        bVar74 = (byte)uVar82;
        if (bVar74 != 0) {
          uVar14 = vcmpps_avx512vl(auVar100,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar233._8_4_ = 0x7f800000;
          auVar233._0_8_ = 0x7f8000007f800000;
          auVar233._12_4_ = 0x7f800000;
          auVar233._16_4_ = 0x7f800000;
          auVar233._20_4_ = 0x7f800000;
          auVar233._24_4_ = 0x7f800000;
          auVar233._28_4_ = 0x7f800000;
          auVar236._8_4_ = 0xff800000;
          auVar236._0_8_ = 0xff800000ff800000;
          auVar236._12_4_ = 0xff800000;
          auVar236._16_4_ = 0xff800000;
          auVar236._20_4_ = 0xff800000;
          auVar236._24_4_ = 0xff800000;
          auVar236._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar233,auVar236);
          bVar80 = (byte)uVar14;
          uVar83 = (uint)(bVar80 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar102._0_4_;
          bVar5 = (bool)((byte)(uVar14 >> 1) & 1);
          uVar137 = (uint)bVar5 * auVar100._4_4_ | (uint)!bVar5 * auVar102._4_4_;
          bVar5 = (bool)((byte)(uVar14 >> 2) & 1);
          uVar138 = (uint)bVar5 * auVar100._8_4_ | (uint)!bVar5 * auVar102._8_4_;
          bVar5 = (bool)((byte)(uVar14 >> 3) & 1);
          uVar139 = (uint)bVar5 * auVar100._12_4_ | (uint)!bVar5 * auVar102._12_4_;
          bVar5 = (bool)((byte)(uVar14 >> 4) & 1);
          uVar140 = (uint)bVar5 * auVar100._16_4_ | (uint)!bVar5 * auVar102._16_4_;
          bVar5 = (bool)((byte)(uVar14 >> 5) & 1);
          uVar141 = (uint)bVar5 * auVar100._20_4_ | (uint)!bVar5 * auVar102._20_4_;
          bVar5 = (bool)((byte)(uVar14 >> 6) & 1);
          uVar142 = (uint)bVar5 * auVar100._24_4_ | (uint)!bVar5 * auVar102._24_4_;
          bVar5 = SUB81(uVar14 >> 7,0);
          uVar143 = (uint)bVar5 * auVar100._28_4_ | (uint)!bVar5 * auVar102._28_4_;
          auVar130._0_4_ = (bVar74 & 1) * uVar83 | !(bool)(bVar74 & 1) * auVar130._0_4_;
          bVar5 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar130._4_4_ = bVar5 * uVar137 | !bVar5 * auVar130._4_4_;
          bVar5 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar130._8_4_ = bVar5 * uVar138 | !bVar5 * auVar130._8_4_;
          bVar5 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar130._12_4_ = bVar5 * uVar139 | !bVar5 * auVar130._12_4_;
          bVar5 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar130._16_4_ = bVar5 * uVar140 | !bVar5 * auVar130._16_4_;
          bVar5 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar130._20_4_ = bVar5 * uVar141 | !bVar5 * auVar130._20_4_;
          bVar5 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar130._24_4_ = bVar5 * uVar142 | !bVar5 * auVar130._24_4_;
          bVar5 = SUB81(uVar82 >> 7,0);
          auVar130._28_4_ = bVar5 * uVar143 | !bVar5 * auVar130._28_4_;
          auVar100 = vblendmps_avx512vl(auVar236,auVar233);
          bVar5 = (bool)((byte)(uVar14 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar14 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar14 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar14 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
          bVar12 = SUB81(uVar14 >> 7,0);
          auVar131._0_4_ =
               (uint)(bVar74 & 1) *
               ((uint)(bVar80 & 1) * auVar100._0_4_ | !(bool)(bVar80 & 1) * uVar83) |
               !(bool)(bVar74 & 1) * auVar131._0_4_;
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar131._4_4_ =
               (uint)bVar6 * ((uint)bVar5 * auVar100._4_4_ | !bVar5 * uVar137) |
               !bVar6 * auVar131._4_4_;
          bVar5 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar131._8_4_ =
               (uint)bVar5 * ((uint)bVar7 * auVar100._8_4_ | !bVar7 * uVar138) |
               !bVar5 * auVar131._8_4_;
          bVar5 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar131._12_4_ =
               (uint)bVar5 * ((uint)bVar8 * auVar100._12_4_ | !bVar8 * uVar139) |
               !bVar5 * auVar131._12_4_;
          bVar5 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar131._16_4_ =
               (uint)bVar5 * ((uint)bVar9 * auVar100._16_4_ | !bVar9 * uVar140) |
               !bVar5 * auVar131._16_4_;
          bVar5 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar131._20_4_ =
               (uint)bVar5 * ((uint)bVar10 * auVar100._20_4_ | !bVar10 * uVar141) |
               !bVar5 * auVar131._20_4_;
          bVar5 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar131._24_4_ =
               (uint)bVar5 * ((uint)bVar11 * auVar100._24_4_ | !bVar11 * uVar142) |
               !bVar5 * auVar131._24_4_;
          bVar5 = SUB81(uVar82 >> 7,0);
          auVar131._28_4_ =
               (uint)bVar5 * ((uint)bVar12 * auVar100._28_4_ | !bVar12 * uVar143) |
               !bVar5 * auVar131._28_4_;
          uVar77 = (ulong)(byte)((~bVar74 | bVar80) & (byte)uVar77);
        }
      }
      auVar262 = ZEXT3264(local_8e0);
      auVar254 = ZEXT3264(local_900);
      auVar255 = ZEXT3264(local_920);
      auVar256 = ZEXT3264(local_940);
      auVar258 = ZEXT3264(local_960);
      auVar260 = ZEXT3264(local_980);
      auVar263 = ZEXT3264(local_9a0);
      auVar266 = ZEXT3264(local_9c0);
      auVar250 = ZEXT3264(local_460);
      auVar234._0_4_ = local_460._0_4_ * auVar228._0_4_;
      auVar234._4_4_ = local_460._4_4_ * auVar228._4_4_;
      auVar234._8_4_ = local_460._8_4_ * auVar228._8_4_;
      auVar234._12_4_ = local_460._12_4_ * auVar228._12_4_;
      auVar234._16_4_ = local_460._16_4_ * auVar228._16_4_;
      auVar234._20_4_ = local_460._20_4_ * auVar228._20_4_;
      auVar234._28_36_ = auVar228._28_36_;
      auVar234._24_4_ = local_460._24_4_ * auVar228._24_4_;
      auVar237 = ZEXT3264(local_440);
      auVar87 = vfmadd231ps_fma(auVar234._0_32_,local_440,auVar101);
      auVar234 = ZEXT3264(local_420);
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_420,auVar99);
      auVar245 = ZEXT3264(_local_5e0);
      _local_200 = _local_5e0;
      local_1e0 = vminps_avx(local_360,auVar130);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar232._16_4_ = 0x7fffffff;
      auVar232._20_4_ = 0x7fffffff;
      auVar232._24_4_ = 0x7fffffff;
      auVar232._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(ZEXT1632(auVar87),auVar232);
      local_380 = vmaxps_avx(_local_5e0,auVar131);
      auVar228 = ZEXT3264(local_380);
      auVar155._8_4_ = 0x3e99999a;
      auVar155._0_8_ = 0x3e99999a3e99999a;
      auVar155._12_4_ = 0x3e99999a;
      auVar155._16_4_ = 0x3e99999a;
      auVar155._20_4_ = 0x3e99999a;
      auVar155._24_4_ = 0x3e99999a;
      auVar155._28_4_ = 0x3e99999a;
      uVar13 = vcmpps_avx512vl(auVar100,auVar155,1);
      local_400._0_2_ = (short)uVar13;
      uVar13 = vcmpps_avx512vl(_local_5e0,local_1e0,2);
      bVar74 = (byte)uVar13 & bVar72;
      uVar15 = vcmpps_avx512vl(local_380,local_360,2);
      auVar257 = ZEXT3264(local_800);
      auVar259 = ZEXT3264(local_820);
      if ((bVar72 & ((byte)uVar15 | (byte)uVar13)) == 0) {
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar265 = ZEXT3264(auVar100);
      }
      else {
        uVar82 = CONCAT71((int7)(uVar77 >> 8),~(byte)uVar77);
        auVar61._4_4_ = local_460._4_4_ * auVar243._4_4_;
        auVar61._0_4_ = local_460._0_4_ * auVar243._0_4_;
        auVar61._8_4_ = local_460._8_4_ * auVar243._8_4_;
        auVar61._12_4_ = local_460._12_4_ * auVar243._12_4_;
        auVar61._16_4_ = local_460._16_4_ * auVar243._16_4_;
        auVar61._20_4_ = local_460._20_4_ * auVar243._20_4_;
        auVar61._24_4_ = local_460._24_4_ * auVar243._24_4_;
        auVar61._28_4_ = 0x3e99999a;
        auVar87 = vfmadd213ps_fma(auVar107,local_440,auVar61);
        auVar87 = vfmadd213ps_fma(auVar98,local_420,ZEXT1632(auVar87));
        auVar100 = vandps_avx(ZEXT1632(auVar87),auVar232);
        uVar13 = vcmpps_avx512vl(auVar100,auVar155,1);
        bVar80 = (byte)uVar13 | ~(byte)uVar77;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar100 = vpblendmd_avx512vl(auVar156,auVar31);
        local_320._0_4_ = (uint)(bVar80 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar5 = (bool)(bVar80 >> 1 & 1);
        local_320._4_4_ = (uint)bVar5 * auVar100._4_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 2 & 1);
        local_320._8_4_ = (uint)bVar5 * auVar100._8_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 3 & 1);
        local_320._12_4_ = (uint)bVar5 * auVar100._12_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 4 & 1);
        local_320._16_4_ = (uint)bVar5 * auVar100._16_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 5 & 1);
        local_320._20_4_ = (uint)bVar5 * auVar100._20_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 6 & 1);
        local_320._24_4_ = (uint)bVar5 * auVar100._24_4_ | (uint)!bVar5 * 2;
        local_320._28_4_ = (uint)(bVar80 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        local_3a0 = vpbroadcastd_avx512vl();
        uVar13 = vpcmpd_avx512vl(local_3a0,local_320,5);
        bVar80 = (byte)uVar13 & bVar74;
        if (bVar80 == 0) {
          auVar158._4_4_ = uVar84;
          auVar158._0_4_ = uVar84;
          auVar158._8_4_ = uVar84;
          auVar158._12_4_ = uVar84;
          auVar158._16_4_ = uVar84;
          auVar158._20_4_ = uVar84;
          auVar158._24_4_ = uVar84;
          auVar158._28_4_ = uVar84;
        }
        else {
          local_340 = local_380;
          local_9cc = (uint)uVar82;
          auVar94 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar87 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar88 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar93 = vminps_avx(auVar94,auVar88);
          auVar94 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vmaxps_avx(auVar87,auVar94);
          auVar183._8_4_ = 0x7fffffff;
          auVar183._0_8_ = 0x7fffffff7fffffff;
          auVar183._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar93,auVar183);
          auVar94 = vandps_avx(auVar88,auVar183);
          auVar87 = vmaxps_avx(auVar87,auVar94);
          auVar94 = vmovshdup_avx(auVar87);
          auVar94 = vmaxss_avx(auVar94,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar94);
          local_770._0_4_ = auVar87._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar88,auVar88,0xff);
          local_3e0 = (float)local_5e0._0_4_ + (float)local_6e0._0_4_;
          fStack_3dc = (float)local_5e0._4_4_ + (float)local_6e0._4_4_;
          fStack_3d8 = fStack_5d8 + fStack_6d8;
          fStack_3d4 = fStack_5d4 + fStack_6d4;
          fStack_3d0 = fStack_5d0 + fStack_6d0;
          fStack_3cc = fStack_5cc + fStack_6cc;
          fStack_3c8 = fStack_5c8 + fStack_6c8;
          fStack_3c4 = fStack_5c4 + fStack_6c4;
          do {
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar157,_local_5e0);
            auVar133._0_4_ =
                 (uint)(bVar80 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar5 * auVar100._4_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar5 * auVar100._8_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar5 * auVar100._12_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar5 * auVar100._16_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar5 * auVar100._20_4_ | (uint)!bVar5 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar80 >> 6) * auVar100._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar100 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar100 = vminps_avx(auVar133,auVar100);
            auVar98 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar98);
            auVar98 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar98);
            uVar13 = vcmpps_avx512vl(auVar133,auVar100,0);
            bVar73 = (byte)uVar13 & bVar80;
            bVar81 = bVar80;
            if (bVar73 != 0) {
              bVar81 = bVar73;
            }
            iVar17 = 0;
            for (uVar84 = (uint)bVar81; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            auVar228 = ZEXT464(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
            auVar237 = ZEXT464(*(uint *)(local_200 + (uint)(iVar17 << 2)));
            fVar235 = local_9c8;
            if ((float)local_700._0_4_ < 0.0) {
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar17 << 2)));
              fVar235 = sqrtf((float)local_700._0_4_);
              auVar237 = ZEXT1664(local_7a0._0_16_);
              auVar228 = ZEXT1664(local_8c0._0_16_);
            }
            lVar79 = 5;
            do {
              local_7a0._0_16_ = auVar237._0_16_;
              uVar166 = auVar237._0_4_;
              auVar146._4_4_ = uVar166;
              auVar146._0_4_ = uVar166;
              auVar146._8_4_ = uVar166;
              auVar146._12_4_ = uVar166;
              auVar87 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_6f0);
              fVar213 = auVar228._0_4_;
              fVar207 = 1.0 - fVar213;
              fVar240 = fVar207 * fVar207 * fVar207;
              fVar238 = fVar213 * fVar213;
              fVar215 = fVar213 * fVar238;
              auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar240),
                                        ZEXT416((uint)fVar215));
              fVar239 = fVar213 * fVar207;
              auVar217 = ZEXT416((uint)fVar207);
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar239 * 6.0)),
                                        ZEXT416((uint)(fVar239 * fVar207)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                        ZEXT416((uint)fVar240));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar207 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar213 * fVar239)));
              fVar240 = fVar240 * 0.16666667;
              fVar213 = (auVar94._0_4_ + auVar93._0_4_) * 0.16666667;
              fVar214 = (auVar88._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar215 = fVar215 * 0.16666667;
              auVar184._0_4_ = fVar215 * (float)local_6c0._0_4_;
              auVar184._4_4_ = fVar215 * (float)local_6c0._4_4_;
              auVar184._8_4_ = fVar215 * fStack_6b8;
              auVar184._12_4_ = fVar215 * fStack_6b4;
              auVar218._4_4_ = fVar214;
              auVar218._0_4_ = fVar214;
              auVar218._8_4_ = fVar214;
              auVar218._12_4_ = fVar214;
              auVar94 = vfmadd132ps_fma(auVar218,auVar184,local_680._0_16_);
              auVar185._4_4_ = fVar213;
              auVar185._0_4_ = fVar213;
              auVar185._8_4_ = fVar213;
              auVar185._12_4_ = fVar213;
              auVar94 = vfmadd132ps_fma(auVar185,auVar94,local_6a0._0_16_);
              auVar168._4_4_ = fVar240;
              auVar168._0_4_ = fVar240;
              auVar168._8_4_ = fVar240;
              auVar168._12_4_ = fVar240;
              auVar94 = vfmadd132ps_fma(auVar168,auVar94,local_660._0_16_);
              local_560._0_16_ = auVar94;
              auVar87 = vsubps_avx(auVar87,auVar94);
              local_720._0_16_ = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_8c0._0_16_ = auVar228._0_16_;
              local_740._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar238;
                local_7e0._0_4_ = fVar239;
                auVar228._0_4_ = sqrtf(auVar87._0_4_);
                auVar228._4_60_ = extraout_var;
                auVar87 = auVar228._0_16_;
                fVar239 = (float)local_7e0._0_4_;
                auVar94 = local_8c0._0_16_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_7c0._0_4_ = fVar238;
                auVar94 = auVar228._0_16_;
              }
              local_580._4_4_ = fVar207;
              local_580._0_4_ = fVar207;
              fStack_578 = fVar207;
              fStack_574 = fVar207;
              auVar88 = vfnmsub213ss_fma(auVar94,auVar94,ZEXT416((uint)(fVar239 * 4.0)));
              auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * 4.0)),auVar217,auVar217);
              fVar238 = fVar207 * -fVar207 * 0.5;
              fVar239 = auVar88._0_4_ * 0.5;
              fVar240 = auVar94._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar208._0_4_ = (float)local_7c0._0_4_ * (float)local_6c0._0_4_;
              auVar208._4_4_ = (float)local_7c0._0_4_ * (float)local_6c0._4_4_;
              auVar208._8_4_ = (float)local_7c0._0_4_ * fStack_6b8;
              auVar208._12_4_ = (float)local_7c0._0_4_ * fStack_6b4;
              auVar169._4_4_ = fVar240;
              auVar169._0_4_ = fVar240;
              auVar169._8_4_ = fVar240;
              auVar169._12_4_ = fVar240;
              auVar94 = vfmadd132ps_fma(auVar169,auVar208,local_680._0_16_);
              auVar186._4_4_ = fVar239;
              auVar186._0_4_ = fVar239;
              auVar186._8_4_ = fVar239;
              auVar186._12_4_ = fVar239;
              auVar94 = vfmadd132ps_fma(auVar186,auVar94,local_6a0._0_16_);
              auVar247._4_4_ = fVar238;
              auVar247._0_4_ = fVar238;
              auVar247._8_4_ = fVar238;
              auVar247._12_4_ = fVar238;
              _local_7c0 = vfmadd132ps_fma(auVar247,auVar94,local_660._0_16_);
              local_5a0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
              auVar63._12_4_ = 0;
              auVar63._0_12_ = ZEXT812(0);
              fVar238 = local_5a0._0_4_;
              local_760 = vrsqrt14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar238));
              fVar239 = local_760._0_4_;
              local_5c0._0_16_ = vrcp14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar238));
              auVar94 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_750._0_4_ = auVar94._0_4_;
              local_7e0._0_4_ = auVar87._0_4_;
              if (fVar238 < -fVar238) {
                auVar237._0_4_ = sqrtf(fVar238);
                auVar237._4_60_ = extraout_var_00;
                auVar87 = ZEXT416((uint)local_7e0._0_4_);
                auVar88 = auVar237._0_16_;
                auVar94 = _local_7c0;
              }
              else {
                auVar88 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
                auVar94 = _local_7c0;
              }
              fVar240 = local_760._0_4_;
              fVar238 = fVar239 * 1.5 + fVar238 * -0.5 * fVar240 * fVar240 * fVar240;
              local_760._0_4_ = auVar94._0_4_ * fVar238;
              local_760._4_4_ = auVar94._4_4_ * fVar238;
              local_760._8_4_ = auVar94._8_4_ * fVar238;
              local_760._12_4_ = auVar94._12_4_ * fVar238;
              auVar93 = vdpps_avx(local_720._0_16_,local_760,0x7f);
              fVar213 = auVar87._0_4_;
              fVar239 = auVar93._0_4_;
              auVar147._0_4_ = fVar239 * fVar239;
              auVar147._4_4_ = auVar93._4_4_ * auVar93._4_4_;
              auVar147._8_4_ = auVar93._8_4_ * auVar93._8_4_;
              auVar147._12_4_ = auVar93._12_4_ * auVar93._12_4_;
              auVar85 = vsubps_avx(local_740._0_16_,auVar147);
              fVar240 = auVar85._0_4_;
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = fVar240;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              auVar86 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar90 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              if (fVar240 < 0.0) {
                local_600._0_4_ = auVar86._0_4_;
                local_620 = fVar238;
                fStack_61c = fVar238;
                fStack_618 = fVar238;
                fStack_614 = fVar238;
                local_610 = auVar89;
                fVar240 = sqrtf(fVar240);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar86 = ZEXT416((uint)local_600._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar87 = ZEXT416((uint)local_7e0._0_4_);
                auVar94 = _local_7c0;
                auVar89 = local_610;
                fVar238 = local_620;
                fVar214 = fStack_61c;
                fVar215 = fStack_618;
                fVar207 = fStack_614;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar240 = auVar85._0_4_;
                fVar214 = fVar238;
                fVar215 = fVar238;
                fVar207 = fVar238;
              }
              auVar250 = ZEXT1664(auVar94);
              auVar245 = ZEXT1664(local_740._0_16_);
              auVar241 = ZEXT1664(local_720._0_16_);
              auVar262 = ZEXT3264(local_8e0);
              auVar254 = ZEXT3264(local_900);
              auVar255 = ZEXT3264(local_920);
              auVar256 = ZEXT3264(local_940);
              auVar257 = ZEXT3264(local_800);
              auVar258 = ZEXT3264(local_960);
              auVar259 = ZEXT3264(local_820);
              auVar260 = ZEXT3264(local_980);
              auVar261 = ZEXT3264(local_840);
              auVar263 = ZEXT3264(local_9a0);
              auVar264 = ZEXT3264(local_860);
              auVar266 = ZEXT3264(local_9c0);
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar217,local_8c0._0_16_);
              auVar85 = vfmadd231ss_fma(auVar217,local_8c0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
              fVar224 = local_8c0._0_4_;
              auVar187._0_4_ = fVar224 * (float)local_6c0._0_4_;
              auVar187._4_4_ = fVar224 * (float)local_6c0._4_4_;
              auVar187._8_4_ = fVar224 * fStack_6b8;
              auVar187._12_4_ = fVar224 * fStack_6b4;
              auVar209._0_4_ = auVar85._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar85 = vfmadd132ps_fma(auVar209,auVar187,local_680._0_16_);
              auVar171._0_4_ = auVar92._0_4_;
              auVar171._4_4_ = auVar171._0_4_;
              auVar171._8_4_ = auVar171._0_4_;
              auVar171._12_4_ = auVar171._0_4_;
              auVar85 = vfmadd132ps_fma(auVar171,auVar85,local_6a0._0_16_);
              auVar85 = vfmadd132ps_fma(_local_580,auVar85,local_660._0_16_);
              auVar172._0_4_ = auVar85._0_4_ * (float)local_5a0._0_4_;
              auVar172._4_4_ = auVar85._4_4_ * (float)local_5a0._0_4_;
              auVar172._8_4_ = auVar85._8_4_ * (float)local_5a0._0_4_;
              auVar172._12_4_ = auVar85._12_4_ * (float)local_5a0._0_4_;
              auVar85 = vdpps_avx(auVar94,auVar85,0x7f);
              fVar216 = auVar85._0_4_;
              auVar188._0_4_ = auVar94._0_4_ * fVar216;
              auVar188._4_4_ = auVar94._4_4_ * fVar216;
              auVar188._8_4_ = auVar94._8_4_ * fVar216;
              auVar188._12_4_ = auVar94._12_4_ * fVar216;
              auVar85 = vsubps_avx(auVar172,auVar188);
              fVar216 = (float)local_750._0_4_ * (float)local_5c0._0_4_;
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar91 = vxorps_avx512vl(auVar94,auVar18);
              auVar219._0_4_ = fVar238 * auVar85._0_4_ * fVar216;
              auVar219._4_4_ = fVar214 * auVar85._4_4_ * fVar216;
              auVar219._8_4_ = fVar215 * auVar85._8_4_ * fVar216;
              auVar219._12_4_ = fVar207 * auVar85._12_4_ * fVar216;
              auVar85 = vdpps_avx(auVar91,local_760,0x7f);
              auVar217 = vmaxss_avx(ZEXT416((uint)local_770._0_4_),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * fVar235 * 1.9073486e-06)
                                           ));
              auVar92 = vdivss_avx512f(ZEXT416((uint)local_770._0_4_),auVar88);
              auVar88 = vdpps_avx(local_720._0_16_,auVar219,0x7f);
              auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)local_770._0_4_),auVar217);
              auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),auVar92,auVar87);
              auVar87 = vdpps_avx(local_6f0,local_760,0x7f);
              fVar238 = auVar85._0_4_ + auVar88._0_4_;
              auVar88 = vdpps_avx(local_720._0_16_,auVar91,0x7f);
              auVar90 = vmulss_avx512f(auVar90,auVar89);
              auVar89 = vmulss_avx512f(auVar89,auVar89);
              auVar85 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar90 = vaddss_avx512f(auVar86,ZEXT416((uint)(auVar90._0_4_ * auVar89._0_4_)));
              auVar89 = vfnmadd231ss_fma(auVar88,auVar93,ZEXT416((uint)fVar238));
              auVar86 = vfnmadd231ss_fma(auVar85,auVar93,auVar87);
              auVar88 = vpermilps_avx(local_560._0_16_,0xff);
              fVar240 = fVar240 - auVar88._0_4_;
              auVar88 = vshufps_avx(auVar94,auVar94,0xff);
              auVar85 = vfmsub213ss_fma(auVar89,auVar90,auVar88);
              fVar213 = auVar86._0_4_ * auVar90._0_4_;
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar238),ZEXT416((uint)fVar213));
              auVar234 = ZEXT1664(auVar89);
              fVar214 = auVar89._0_4_;
              fVar224 = fVar224 - (fVar239 * (fVar213 / fVar214) -
                                  fVar240 * (auVar87._0_4_ / fVar214));
              auVar228 = ZEXT464((uint)fVar224);
              fVar238 = (float)local_7a0._0_4_ -
                        (fVar240 * (fVar238 / fVar214) - fVar239 * (auVar85._0_4_ / fVar214));
              auVar237 = ZEXT464((uint)fVar238);
              auVar19._8_4_ = 0x7fffffff;
              auVar19._0_8_ = 0x7fffffff7fffffff;
              auVar19._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx512vl(auVar93,auVar19);
              if (auVar87._0_4_ < auVar92._0_4_) {
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar217._0_4_)),local_630,
                                          ZEXT416(0x36000000));
                auVar20._8_4_ = 0x7fffffff;
                auVar20._0_8_ = 0x7fffffff7fffffff;
                auVar20._12_4_ = 0x7fffffff;
                auVar93 = vandps_avx512vl(ZEXT416((uint)fVar240),auVar20);
                if (auVar93._0_4_ < auVar87._0_4_) {
                  fVar235 = fVar238 + (float)local_640._0_4_;
                  if ((((fVar235 < fVar144) ||
                       (fVar239 = *(float *)(ray + k * 4 + 0x80), fVar239 < fVar235)) ||
                      (fVar224 < 0.0)) || (1.0 < fVar224)) break;
                  auVar189._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar189._0_4_ = local_740._0_4_;
                  auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar189);
                  fVar240 = auVar87._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar78].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar240 = fVar240 * 1.5 + local_740._0_4_ * -0.5 * fVar240 * fVar240 * fVar240;
                  auVar190._0_4_ = local_720._0_4_ * fVar240;
                  auVar190._4_4_ = local_720._4_4_ * fVar240;
                  auVar190._8_4_ = local_720._8_4_ * fVar240;
                  auVar190._12_4_ = local_720._12_4_ * fVar240;
                  auVar85 = vfmadd213ps_fma(auVar88,auVar190,auVar94);
                  auVar87 = vshufps_avx(auVar190,auVar190,0xc9);
                  auVar88 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar191._0_4_ = auVar190._0_4_ * auVar88._0_4_;
                  auVar191._4_4_ = auVar190._4_4_ * auVar88._4_4_;
                  auVar191._8_4_ = auVar190._8_4_ * auVar88._8_4_;
                  auVar191._12_4_ = auVar190._12_4_ * auVar88._12_4_;
                  auVar93 = vfmsub231ps_fma(auVar191,auVar94,auVar87);
                  auVar87 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar88 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                  auVar148._0_4_ = auVar85._0_4_ * auVar93._0_4_;
                  auVar148._4_4_ = auVar85._4_4_ * auVar93._4_4_;
                  auVar148._8_4_ = auVar85._8_4_ * auVar93._8_4_;
                  auVar148._12_4_ = auVar85._12_4_ * auVar93._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar148,auVar87,auVar88);
                  uVar166 = auVar87._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar235;
                    uVar2 = vextractps_avx(auVar87,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar87,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar166;
                    *(float *)(ray + k * 4 + 0xf0) = fVar224;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_9d8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar78;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_500 = (RTCHitN  [16])vshufps_avx(auVar87,auVar87,0x55);
                  auStack_4f0 = vshufps_avx(auVar87,auVar87,0xaa);
                  local_4e0 = uVar166;
                  uStack_4dc = uVar166;
                  uStack_4d8 = uVar166;
                  uStack_4d4 = uVar166;
                  local_4d0 = fVar224;
                  fStack_4cc = fVar224;
                  fStack_4c8 = fVar224;
                  fStack_4c4 = fVar224;
                  local_4c0 = ZEXT416(0) << 0x20;
                  local_4b0 = local_520._0_8_;
                  uStack_4a8 = local_520._8_8_;
                  local_4a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_48c = context->user->instID[0];
                  local_490 = uStack_48c;
                  uStack_488 = uStack_48c;
                  uStack_484 = uStack_48c;
                  uStack_480 = context->user->instPrimID[0];
                  uStack_47c = uStack_480;
                  uStack_478 = uStack_480;
                  uStack_474 = uStack_480;
                  *(float *)(ray + k * 4 + 0x80) = fVar235;
                  local_9f0 = local_530;
                  local_890.valid = (int *)local_9f0;
                  local_890.geometryUserPtr = pGVar3->userPtr;
                  local_890.context = context->user;
                  local_890.hit = local_500;
                  local_890.N = 4;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar234 = ZEXT1664(auVar89);
                    auVar237 = ZEXT464((uint)fVar238);
                    auVar241 = ZEXT1664(local_720._0_16_);
                    auVar245 = ZEXT1664(local_740._0_16_);
                    auVar250 = ZEXT1664(auVar94);
                    (*pGVar3->intersectionFilterN)(&local_890);
                    auVar266 = ZEXT3264(local_9c0);
                    auVar264 = ZEXT3264(local_860);
                    auVar263 = ZEXT3264(local_9a0);
                    auVar261 = ZEXT3264(local_840);
                    auVar260 = ZEXT3264(local_980);
                    auVar259 = ZEXT3264(local_820);
                    auVar258 = ZEXT3264(local_960);
                    auVar257 = ZEXT3264(local_800);
                    auVar256 = ZEXT3264(local_940);
                    auVar255 = ZEXT3264(local_920);
                    auVar254 = ZEXT3264(local_900);
                    auVar262 = ZEXT3264(local_8e0);
                  }
                  uVar77 = vptestmd_avx512vl(local_9f0,local_9f0);
                  if ((uVar77 & 0xf) != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      auVar241 = ZEXT1664(auVar241._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      auVar250 = ZEXT1664(auVar250._0_16_);
                      (*p_Var4)(&local_890);
                      auVar266 = ZEXT3264(local_9c0);
                      auVar264 = ZEXT3264(local_860);
                      auVar263 = ZEXT3264(local_9a0);
                      auVar261 = ZEXT3264(local_840);
                      auVar260 = ZEXT3264(local_980);
                      auVar259 = ZEXT3264(local_820);
                      auVar258 = ZEXT3264(local_960);
                      auVar257 = ZEXT3264(local_800);
                      auVar256 = ZEXT3264(local_940);
                      auVar255 = ZEXT3264(local_920);
                      auVar254 = ZEXT3264(local_900);
                      auVar262 = ZEXT3264(local_8e0);
                    }
                    uVar77 = vptestmd_avx512vl(local_9f0,local_9f0);
                    uVar77 = uVar77 & 0xf;
                    bVar81 = (byte)uVar77;
                    if (bVar81 != 0) {
                      iVar65 = *(int *)(local_890.hit + 4);
                      iVar66 = *(int *)(local_890.hit + 8);
                      iVar67 = *(int *)(local_890.hit + 0xc);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xc0) =
                           (uint)(bVar81 & 1) * *(int *)local_890.hit |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xc0);
                      *(uint *)(local_890.ray + 0xc4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xc4);
                      *(uint *)(local_890.ray + 200) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 200);
                      *(uint *)(local_890.ray + 0xcc) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xcc);
                      iVar65 = *(int *)(local_890.hit + 0x14);
                      iVar66 = *(int *)(local_890.hit + 0x18);
                      iVar67 = *(int *)(local_890.hit + 0x1c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xd0) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x10) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xd0);
                      *(uint *)(local_890.ray + 0xd4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xd4);
                      *(uint *)(local_890.ray + 0xd8) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0xd8);
                      *(uint *)(local_890.ray + 0xdc) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xdc);
                      iVar65 = *(int *)(local_890.hit + 0x24);
                      iVar66 = *(int *)(local_890.hit + 0x28);
                      iVar67 = *(int *)(local_890.hit + 0x2c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xe0) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x20) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xe0);
                      *(uint *)(local_890.ray + 0xe4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xe4);
                      *(uint *)(local_890.ray + 0xe8) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0xe8);
                      *(uint *)(local_890.ray + 0xec) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xec);
                      iVar65 = *(int *)(local_890.hit + 0x34);
                      iVar66 = *(int *)(local_890.hit + 0x38);
                      iVar67 = *(int *)(local_890.hit + 0x3c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xf0) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x30) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xf0);
                      *(uint *)(local_890.ray + 0xf4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xf4);
                      *(uint *)(local_890.ray + 0xf8) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0xf8);
                      *(uint *)(local_890.ray + 0xfc) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xfc);
                      iVar65 = *(int *)(local_890.hit + 0x44);
                      iVar66 = *(int *)(local_890.hit + 0x48);
                      iVar67 = *(int *)(local_890.hit + 0x4c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0x100) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x40) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0x100);
                      *(uint *)(local_890.ray + 0x104) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0x104);
                      *(uint *)(local_890.ray + 0x108) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0x108);
                      *(uint *)(local_890.ray + 0x10c) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0x10c);
                      auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x50));
                      *(undefined1 (*) [16])(local_890.ray + 0x110) = auVar87;
                      auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x60));
                      *(undefined1 (*) [16])(local_890.ray + 0x120) = auVar87;
                      auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x70));
                      *(undefined1 (*) [16])(local_890.ray + 0x130) = auVar87;
                      auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x80));
                      *(undefined1 (*) [16])(local_890.ray + 0x140) = auVar87;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar239;
                  break;
                }
              }
              lVar79 = lVar79 + -1;
            } while (lVar79 != 0);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar158._4_4_ = uVar166;
            auVar158._0_4_ = uVar166;
            auVar158._8_4_ = uVar166;
            auVar158._12_4_ = uVar166;
            auVar158._16_4_ = uVar166;
            auVar158._20_4_ = uVar166;
            auVar158._24_4_ = uVar166;
            auVar158._28_4_ = uVar166;
            auVar68._4_4_ = fStack_3dc;
            auVar68._0_4_ = local_3e0;
            auVar68._8_4_ = fStack_3d8;
            auVar68._12_4_ = fStack_3d4;
            auVar68._16_4_ = fStack_3d0;
            auVar68._20_4_ = fStack_3cc;
            auVar68._24_4_ = fStack_3c8;
            auVar68._28_4_ = fStack_3c4;
            uVar13 = vcmpps_avx512vl(auVar158,auVar68,0xd);
            bVar80 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar80 & (byte)uVar13;
          } while (bVar80 != 0);
          uVar82 = (ulong)local_9cc;
          auVar228 = ZEXT3264(local_340);
        }
        bVar80 = local_400[0] | (byte)uVar82;
        auVar180._0_4_ = (float)local_6e0._0_4_ + auVar228._0_4_;
        auVar180._4_4_ = (float)local_6e0._4_4_ + auVar228._4_4_;
        auVar180._8_4_ = fStack_6d8 + auVar228._8_4_;
        auVar180._12_4_ = fStack_6d4 + auVar228._12_4_;
        auVar180._16_4_ = fStack_6d0 + auVar228._16_4_;
        auVar180._20_4_ = fStack_6cc + auVar228._20_4_;
        auVar180._24_4_ = fStack_6c8 + auVar228._24_4_;
        auVar180._28_4_ = fStack_6c4 + auVar228._28_4_;
        uVar13 = vcmpps_avx512vl(auVar180,auVar158,2);
        bVar72 = (byte)uVar15 & bVar72 & (byte)uVar13;
        auVar181._8_4_ = 2;
        auVar181._0_8_ = 0x200000002;
        auVar181._12_4_ = 2;
        auVar181._16_4_ = 2;
        auVar181._20_4_ = 2;
        auVar181._24_4_ = 2;
        auVar181._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar100 = vpblendmd_avx512vl(auVar181,auVar32);
        auVar134._0_4_ = (uint)(bVar80 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar5 = (bool)(bVar80 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar5 * auVar100._4_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar5 * auVar100._8_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar5 * auVar100._12_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar5 * auVar100._16_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar5 * auVar100._20_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar80 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar5 * auVar100._24_4_ | (uint)!bVar5 * 2;
        auVar134._28_4_ = (uint)(bVar80 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        uVar13 = vpcmpd_avx512vl(local_3a0,auVar134,5);
        bVar80 = (byte)uVar13 & bVar72;
        fVar235 = (float)local_6e0._0_4_;
        fVar238 = (float)local_6e0._4_4_;
        fVar239 = fStack_6d8;
        fVar240 = fStack_6d4;
        fVar213 = fStack_6d0;
        fVar214 = fStack_6cc;
        fVar215 = fStack_6c8;
        fVar207 = fStack_6c4;
        if (bVar80 != 0) {
          local_400 = auVar134;
          auVar94 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar87 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar88 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar93 = vminps_avx(auVar94,auVar88);
          auVar94 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vmaxps_avx(auVar87,auVar94);
          auVar192._8_4_ = 0x7fffffff;
          auVar192._0_8_ = 0x7fffffff7fffffff;
          auVar192._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar93,auVar192);
          auVar94 = vandps_avx(auVar88,auVar192);
          auVar87 = vmaxps_avx(auVar87,auVar94);
          auVar94 = vmovshdup_avx(auVar87);
          auVar94 = vmaxss_avx(auVar94,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar94);
          fVar235 = auVar87._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar88,auVar88,0xff);
          local_3e0 = (float)local_6e0._0_4_ + local_380._0_4_;
          fStack_3dc = (float)local_6e0._4_4_ + local_380._4_4_;
          fStack_3d8 = fStack_6d8 + local_380._8_4_;
          fStack_3d4 = fStack_6d4 + local_380._12_4_;
          fStack_3d0 = fStack_6d0 + local_380._16_4_;
          fStack_3cc = fStack_6cc + local_380._20_4_;
          fStack_3c8 = fStack_6c8 + local_380._24_4_;
          fStack_3c4 = fStack_6c4 + local_380._28_4_;
          _local_5e0 = local_380;
          do {
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar159,_local_5e0);
            auVar135._0_4_ =
                 (uint)(bVar80 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar5 * auVar100._4_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar5 * auVar100._8_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar5 * auVar100._12_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar5 * auVar100._16_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar80 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar5 * auVar100._20_4_ | (uint)!bVar5 * 0x7f800000;
            auVar135._24_4_ =
                 (uint)(bVar80 >> 6) * auVar100._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar100 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar100 = vminps_avx(auVar135,auVar100);
            auVar98 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar98);
            auVar98 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar98);
            uVar13 = vcmpps_avx512vl(auVar135,auVar100,0);
            bVar73 = (byte)uVar13 & bVar80;
            bVar81 = bVar80;
            if (bVar73 != 0) {
              bVar81 = bVar73;
            }
            iVar17 = 0;
            for (uVar84 = (uint)bVar81; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            auVar265 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
            auVar237 = ZEXT464(*(uint *)(local_360 + (uint)(iVar17 << 2)));
            fVar238 = local_9c4;
            if ((float)local_700._0_4_ < 0.0) {
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_360 + (uint)(iVar17 << 2)));
              fVar238 = sqrtf((float)local_700._0_4_);
              auVar237 = ZEXT1664(local_7a0._0_16_);
              auVar265 = ZEXT1664(local_8c0._0_16_);
            }
            local_760._0_4_ = fVar238 * 1.9073486e-06;
            lVar79 = 5;
            do {
              local_7a0._0_16_ = auVar237._0_16_;
              uVar166 = auVar237._0_4_;
              auVar149._4_4_ = uVar166;
              auVar149._0_4_ = uVar166;
              auVar149._8_4_ = uVar166;
              auVar149._12_4_ = uVar166;
              auVar87 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_6f0);
              fVar213 = auVar265._0_4_;
              fVar207 = 1.0 - fVar213;
              fVar240 = fVar207 * fVar207 * fVar207;
              fVar238 = fVar213 * fVar213;
              fVar215 = fVar213 * fVar238;
              auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar240),
                                        ZEXT416((uint)fVar215));
              fVar239 = fVar213 * fVar207;
              auVar217 = ZEXT416((uint)fVar207);
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar239 * 6.0)),
                                        ZEXT416((uint)(fVar239 * fVar207)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                        ZEXT416((uint)fVar240));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar207 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar213 * fVar239)));
              fVar240 = fVar240 * 0.16666667;
              fVar213 = (auVar94._0_4_ + auVar93._0_4_) * 0.16666667;
              fVar214 = (auVar88._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar215 = fVar215 * 0.16666667;
              auVar193._0_4_ = fVar215 * (float)local_6c0._0_4_;
              auVar193._4_4_ = fVar215 * (float)local_6c0._4_4_;
              auVar193._8_4_ = fVar215 * fStack_6b8;
              auVar193._12_4_ = fVar215 * fStack_6b4;
              auVar220._4_4_ = fVar214;
              auVar220._0_4_ = fVar214;
              auVar220._8_4_ = fVar214;
              auVar220._12_4_ = fVar214;
              auVar94 = vfmadd132ps_fma(auVar220,auVar193,local_680._0_16_);
              auVar194._4_4_ = fVar213;
              auVar194._0_4_ = fVar213;
              auVar194._8_4_ = fVar213;
              auVar194._12_4_ = fVar213;
              auVar94 = vfmadd132ps_fma(auVar194,auVar94,local_6a0._0_16_);
              auVar173._4_4_ = fVar240;
              auVar173._0_4_ = fVar240;
              auVar173._8_4_ = fVar240;
              auVar173._12_4_ = fVar240;
              auVar94 = vfmadd132ps_fma(auVar173,auVar94,local_660._0_16_);
              local_560._0_16_ = auVar94;
              auVar87 = vsubps_avx(auVar87,auVar94);
              local_720._0_16_ = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_8c0._0_16_ = auVar265._0_16_;
              local_740._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar238;
                local_7e0._0_4_ = fVar239;
                auVar241._0_4_ = sqrtf(auVar87._0_4_);
                auVar241._4_60_ = extraout_var_01;
                auVar87 = auVar241._0_16_;
                fVar239 = (float)local_7e0._0_4_;
                auVar94 = local_8c0._0_16_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_7c0._0_4_ = fVar238;
                auVar94 = auVar265._0_16_;
              }
              local_580._4_4_ = fVar207;
              local_580._0_4_ = fVar207;
              fStack_578 = fVar207;
              fStack_574 = fVar207;
              auVar88 = vfnmsub213ss_fma(auVar94,auVar94,ZEXT416((uint)(fVar239 * 4.0)));
              auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * 4.0)),auVar217,auVar217);
              fVar238 = fVar207 * -fVar207 * 0.5;
              fVar239 = auVar88._0_4_ * 0.5;
              fVar240 = auVar94._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar210._0_4_ = (float)local_7c0._0_4_ * (float)local_6c0._0_4_;
              auVar210._4_4_ = (float)local_7c0._0_4_ * (float)local_6c0._4_4_;
              auVar210._8_4_ = (float)local_7c0._0_4_ * fStack_6b8;
              auVar210._12_4_ = (float)local_7c0._0_4_ * fStack_6b4;
              auVar174._4_4_ = fVar240;
              auVar174._0_4_ = fVar240;
              auVar174._8_4_ = fVar240;
              auVar174._12_4_ = fVar240;
              auVar94 = vfmadd132ps_fma(auVar174,auVar210,local_680._0_16_);
              auVar195._4_4_ = fVar239;
              auVar195._0_4_ = fVar239;
              auVar195._8_4_ = fVar239;
              auVar195._12_4_ = fVar239;
              auVar94 = vfmadd132ps_fma(auVar195,auVar94,local_6a0._0_16_);
              auVar248._4_4_ = fVar238;
              auVar248._0_4_ = fVar238;
              auVar248._8_4_ = fVar238;
              auVar248._12_4_ = fVar238;
              _local_7c0 = vfmadd132ps_fma(auVar248,auVar94,local_660._0_16_);
              local_5a0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
              auVar64._12_4_ = 0;
              auVar64._0_12_ = ZEXT812(0);
              fVar238 = local_5a0._0_4_;
              auVar88 = vrsqrt14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar238));
              local_5c0._0_16_ = vrcp14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar238));
              auVar94 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_750._0_4_ = auVar94._0_4_;
              local_7e0._0_4_ = auVar87._0_4_;
              if (fVar238 < -fVar238) {
                local_770 = auVar88;
                auVar245._0_4_ = sqrtf(fVar238);
                auVar245._4_60_ = extraout_var_02;
                auVar87 = ZEXT416((uint)local_7e0._0_4_);
                auVar85 = auVar245._0_16_;
                auVar94 = local_770;
                auVar93 = _local_7c0;
              }
              else {
                auVar85 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
                auVar94 = auVar88;
                auVar93 = _local_7c0;
              }
              fVar239 = auVar94._0_4_;
              fVar238 = auVar88._0_4_ * 1.5 + fVar238 * -0.5 * fVar239 * fVar239 * fVar239;
              auVar253._0_4_ = auVar93._0_4_ * fVar238;
              auVar253._4_4_ = auVar93._4_4_ * fVar238;
              auVar253._8_4_ = auVar93._8_4_ * fVar238;
              auVar253._12_4_ = auVar93._12_4_ * fVar238;
              auVar94 = vdpps_avx(local_720._0_16_,auVar253,0x7f);
              fVar239 = auVar87._0_4_ + 1.0;
              fVar240 = auVar94._0_4_;
              auVar150._0_4_ = fVar240 * fVar240;
              auVar150._4_4_ = auVar94._4_4_ * auVar94._4_4_;
              auVar150._8_4_ = auVar94._8_4_ * auVar94._8_4_;
              auVar150._12_4_ = auVar94._12_4_ * auVar94._12_4_;
              auVar88 = vsubps_avx(local_740._0_16_,auVar150);
              fVar213 = auVar88._0_4_;
              auVar175._4_12_ = ZEXT812(0) << 0x20;
              auVar175._0_4_ = fVar213;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
              auVar86 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar90 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
              if (fVar213 < 0.0) {
                local_770._0_4_ = fVar239;
                local_620 = fVar238;
                fStack_61c = fVar238;
                fStack_618 = fVar238;
                fStack_614 = fVar238;
                local_610 = auVar253;
                local_600 = auVar89;
                fVar213 = sqrtf(fVar213);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar87 = ZEXT416((uint)local_7e0._0_4_);
                auVar93 = _local_7c0;
                fVar239 = (float)local_770._0_4_;
                auVar253 = local_610;
                auVar89 = local_600;
                fVar238 = local_620;
                fVar214 = fStack_61c;
                fVar215 = fStack_618;
                fVar207 = fStack_614;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                fVar213 = auVar88._0_4_;
                fVar214 = fVar238;
                fVar215 = fVar238;
                fVar207 = fVar238;
              }
              auVar250 = ZEXT1664(auVar93);
              auVar245 = ZEXT1664(local_740._0_16_);
              auVar241 = ZEXT1664(local_720._0_16_);
              auVar262 = ZEXT3264(local_8e0);
              auVar254 = ZEXT3264(local_900);
              auVar255 = ZEXT3264(local_920);
              auVar256 = ZEXT3264(local_940);
              auVar257 = ZEXT3264(local_800);
              auVar258 = ZEXT3264(local_960);
              auVar259 = ZEXT3264(local_820);
              auVar260 = ZEXT3264(local_980);
              auVar261 = ZEXT3264(local_840);
              auVar263 = ZEXT3264(local_9a0);
              auVar264 = ZEXT3264(local_860);
              auVar266 = ZEXT3264(local_9c0);
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar217,local_8c0._0_16_);
              auVar88 = vfmadd231ss_fma(auVar217,local_8c0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
              fVar224 = local_8c0._0_4_;
              auVar196._0_4_ = fVar224 * (float)local_6c0._0_4_;
              auVar196._4_4_ = fVar224 * (float)local_6c0._4_4_;
              auVar196._8_4_ = fVar224 * fStack_6b8;
              auVar196._12_4_ = fVar224 * fStack_6b4;
              auVar211._0_4_ = auVar88._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar88 = vfmadd132ps_fma(auVar211,auVar196,local_680._0_16_);
              auVar176._0_4_ = auVar92._0_4_;
              auVar176._4_4_ = auVar176._0_4_;
              auVar176._8_4_ = auVar176._0_4_;
              auVar176._12_4_ = auVar176._0_4_;
              auVar88 = vfmadd132ps_fma(auVar176,auVar88,local_6a0._0_16_);
              auVar88 = vfmadd132ps_fma(_local_580,auVar88,local_660._0_16_);
              auVar177._0_4_ = auVar88._0_4_ * (float)local_5a0._0_4_;
              auVar177._4_4_ = auVar88._4_4_ * (float)local_5a0._0_4_;
              auVar177._8_4_ = auVar88._8_4_ * (float)local_5a0._0_4_;
              auVar177._12_4_ = auVar88._12_4_ * (float)local_5a0._0_4_;
              auVar88 = vdpps_avx(auVar93,auVar88,0x7f);
              fVar216 = auVar88._0_4_;
              auVar197._0_4_ = auVar93._0_4_ * fVar216;
              auVar197._4_4_ = auVar93._4_4_ * fVar216;
              auVar197._8_4_ = auVar93._8_4_ * fVar216;
              auVar197._12_4_ = auVar93._12_4_ * fVar216;
              auVar88 = vsubps_avx(auVar177,auVar197);
              fVar216 = (float)local_750._0_4_ * (float)local_5c0._0_4_;
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar91 = vxorps_avx512vl(auVar93,auVar21);
              auVar221._0_4_ = fVar238 * auVar88._0_4_ * fVar216;
              auVar221._4_4_ = fVar214 * auVar88._4_4_ * fVar216;
              auVar221._8_4_ = fVar215 * auVar88._8_4_ * fVar216;
              auVar221._12_4_ = fVar207 * auVar88._12_4_ * fVar216;
              auVar88 = vdpps_avx(auVar91,auVar253,0x7f);
              auVar217 = vmaxss_avx(ZEXT416((uint)fVar235),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * (float)local_760._0_4_))
                                   );
              auVar92 = vdivss_avx512f(ZEXT416((uint)fVar235),auVar85);
              auVar85 = vdpps_avx(local_720._0_16_,auVar221,0x7f);
              auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar235),auVar217);
              auVar92 = vfmadd213ss_fma(ZEXT416((uint)fVar239),auVar92,auVar87);
              auVar87 = vdpps_avx(local_6f0,auVar253,0x7f);
              fVar238 = auVar88._0_4_ + auVar85._0_4_;
              auVar88 = vdpps_avx(local_720._0_16_,auVar91,0x7f);
              auVar90 = vmulss_avx512f(auVar90,auVar89);
              auVar89 = vmulss_avx512f(auVar89,auVar89);
              auVar85 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar90 = vaddss_avx512f(auVar86,ZEXT416((uint)(auVar90._0_4_ * auVar89._0_4_)));
              auVar89 = vfnmadd231ss_fma(auVar88,auVar94,ZEXT416((uint)fVar238));
              auVar86 = vfnmadd231ss_fma(auVar85,auVar94,auVar87);
              auVar88 = vpermilps_avx(local_560._0_16_,0xff);
              fVar213 = fVar213 - auVar88._0_4_;
              auVar88 = vshufps_avx(auVar93,auVar93,0xff);
              auVar85 = vfmsub213ss_fma(auVar89,auVar90,auVar88);
              fVar239 = auVar86._0_4_ * auVar90._0_4_;
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar238),ZEXT416((uint)fVar239));
              auVar234 = ZEXT1664(auVar89);
              fVar215 = auVar89._0_4_;
              fVar214 = fVar240 * (auVar85._0_4_ / fVar215);
              auVar228 = ZEXT464((uint)fVar214);
              fVar224 = fVar224 - (fVar240 * (fVar239 / fVar215) -
                                  fVar213 * (auVar87._0_4_ / fVar215));
              auVar265 = ZEXT464((uint)fVar224);
              fVar238 = (float)local_7a0._0_4_ - (fVar213 * (fVar238 / fVar215) - fVar214);
              auVar237 = ZEXT464((uint)fVar238);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx512vl(auVar94,auVar22);
              if (auVar87._0_4_ < auVar92._0_4_) {
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar217._0_4_)),local_630,
                                          ZEXT416(0x36000000));
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar94 = vandps_avx512vl(ZEXT416((uint)fVar213),auVar23);
                if (auVar94._0_4_ < auVar87._0_4_) {
                  fVar239 = fVar238 + (float)local_640._0_4_;
                  if (fVar239 < fVar144) break;
                  fVar240 = *(float *)(ray + k * 4 + 0x80);
                  auVar228 = ZEXT464((uint)fVar240);
                  if (((fVar240 < fVar239) || (fVar224 < 0.0)) || (1.0 < fVar224)) break;
                  auVar198._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar198._0_4_ = local_740._0_4_;
                  auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar198);
                  fVar213 = auVar87._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar78].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar213 = fVar213 * 1.5 + local_740._0_4_ * -0.5 * fVar213 * fVar213 * fVar213;
                  auVar199._0_4_ = local_720._0_4_ * fVar213;
                  auVar199._4_4_ = local_720._4_4_ * fVar213;
                  auVar199._8_4_ = local_720._8_4_ * fVar213;
                  auVar199._12_4_ = local_720._12_4_ * fVar213;
                  auVar85 = vfmadd213ps_fma(auVar88,auVar199,auVar93);
                  auVar87 = vshufps_avx(auVar199,auVar199,0xc9);
                  auVar94 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar200._0_4_ = auVar199._0_4_ * auVar94._0_4_;
                  auVar200._4_4_ = auVar199._4_4_ * auVar94._4_4_;
                  auVar200._8_4_ = auVar199._8_4_ * auVar94._8_4_;
                  auVar200._12_4_ = auVar199._12_4_ * auVar94._12_4_;
                  auVar88 = vfmsub231ps_fma(auVar200,auVar93,auVar87);
                  auVar87 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar94 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                  auVar151._0_4_ = auVar85._0_4_ * auVar88._0_4_;
                  auVar151._4_4_ = auVar85._4_4_ * auVar88._4_4_;
                  auVar151._8_4_ = auVar85._8_4_ * auVar88._8_4_;
                  auVar151._12_4_ = auVar85._12_4_ * auVar88._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar151,auVar87,auVar94);
                  uVar166 = auVar87._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar239;
                    uVar2 = vextractps_avx(auVar87,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar87,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar166;
                    *(float *)(ray + k * 4 + 0xf0) = fVar224;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_9d8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar78;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_500 = (RTCHitN  [16])vshufps_avx(auVar87,auVar87,0x55);
                  auStack_4f0 = vshufps_avx(auVar87,auVar87,0xaa);
                  local_4e0 = uVar166;
                  uStack_4dc = uVar166;
                  uStack_4d8 = uVar166;
                  uStack_4d4 = uVar166;
                  local_4d0 = fVar224;
                  fStack_4cc = fVar224;
                  fStack_4c8 = fVar224;
                  fStack_4c4 = fVar224;
                  local_4c0 = ZEXT416(0) << 0x20;
                  local_4b0 = local_520._0_8_;
                  uStack_4a8 = local_520._8_8_;
                  local_4a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_48c = context->user->instID[0];
                  local_490 = uStack_48c;
                  uStack_488 = uStack_48c;
                  uStack_484 = uStack_48c;
                  uStack_480 = context->user->instPrimID[0];
                  uStack_47c = uStack_480;
                  uStack_478 = uStack_480;
                  uStack_474 = uStack_480;
                  *(float *)(ray + k * 4 + 0x80) = fVar239;
                  local_9f0 = local_530;
                  local_890.valid = (int *)local_9f0;
                  local_890.geometryUserPtr = pGVar3->userPtr;
                  local_890.context = context->user;
                  local_890.hit = local_500;
                  local_890.N = 4;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar234 = ZEXT1664(auVar89);
                    auVar237 = ZEXT464((uint)fVar238);
                    auVar241 = ZEXT1664(local_720._0_16_);
                    auVar245 = ZEXT1664(local_740._0_16_);
                    auVar250 = ZEXT1664(auVar93);
                    (*pGVar3->intersectionFilterN)(&local_890);
                    auVar266 = ZEXT3264(local_9c0);
                    auVar264 = ZEXT3264(local_860);
                    auVar263 = ZEXT3264(local_9a0);
                    auVar261 = ZEXT3264(local_840);
                    auVar260 = ZEXT3264(local_980);
                    auVar259 = ZEXT3264(local_820);
                    auVar258 = ZEXT3264(local_960);
                    auVar257 = ZEXT3264(local_800);
                    auVar256 = ZEXT3264(local_940);
                    auVar255 = ZEXT3264(local_920);
                    auVar254 = ZEXT3264(local_900);
                    auVar262 = ZEXT3264(local_8e0);
                  }
                  uVar77 = vptestmd_avx512vl(local_9f0,local_9f0);
                  if ((uVar77 & 0xf) != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      auVar241 = ZEXT1664(auVar241._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      auVar250 = ZEXT1664(auVar250._0_16_);
                      (*p_Var4)(&local_890);
                      auVar266 = ZEXT3264(local_9c0);
                      auVar264 = ZEXT3264(local_860);
                      auVar263 = ZEXT3264(local_9a0);
                      auVar261 = ZEXT3264(local_840);
                      auVar260 = ZEXT3264(local_980);
                      auVar259 = ZEXT3264(local_820);
                      auVar258 = ZEXT3264(local_960);
                      auVar257 = ZEXT3264(local_800);
                      auVar256 = ZEXT3264(local_940);
                      auVar255 = ZEXT3264(local_920);
                      auVar254 = ZEXT3264(local_900);
                      auVar262 = ZEXT3264(local_8e0);
                    }
                    auVar228 = ZEXT464((uint)fVar240);
                    uVar77 = vptestmd_avx512vl(local_9f0,local_9f0);
                    uVar77 = uVar77 & 0xf;
                    bVar81 = (byte)uVar77;
                    if (bVar81 != 0) {
                      iVar65 = *(int *)(local_890.hit + 4);
                      iVar66 = *(int *)(local_890.hit + 8);
                      iVar67 = *(int *)(local_890.hit + 0xc);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xc0) =
                           (uint)(bVar81 & 1) * *(int *)local_890.hit |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xc0);
                      *(uint *)(local_890.ray + 0xc4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xc4);
                      *(uint *)(local_890.ray + 200) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 200);
                      *(uint *)(local_890.ray + 0xcc) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xcc);
                      iVar65 = *(int *)(local_890.hit + 0x14);
                      iVar66 = *(int *)(local_890.hit + 0x18);
                      iVar67 = *(int *)(local_890.hit + 0x1c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xd0) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x10) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xd0);
                      *(uint *)(local_890.ray + 0xd4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xd4);
                      *(uint *)(local_890.ray + 0xd8) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0xd8);
                      *(uint *)(local_890.ray + 0xdc) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xdc);
                      iVar65 = *(int *)(local_890.hit + 0x24);
                      iVar66 = *(int *)(local_890.hit + 0x28);
                      iVar67 = *(int *)(local_890.hit + 0x2c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xe0) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x20) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xe0);
                      *(uint *)(local_890.ray + 0xe4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xe4);
                      *(uint *)(local_890.ray + 0xe8) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0xe8);
                      *(uint *)(local_890.ray + 0xec) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xec);
                      iVar65 = *(int *)(local_890.hit + 0x34);
                      iVar66 = *(int *)(local_890.hit + 0x38);
                      iVar67 = *(int *)(local_890.hit + 0x3c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0xf0) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x30) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0xf0);
                      *(uint *)(local_890.ray + 0xf4) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0xf4);
                      *(uint *)(local_890.ray + 0xf8) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0xf8);
                      *(uint *)(local_890.ray + 0xfc) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0xfc);
                      iVar65 = *(int *)(local_890.hit + 0x44);
                      iVar66 = *(int *)(local_890.hit + 0x48);
                      iVar67 = *(int *)(local_890.hit + 0x4c);
                      bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar7 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_890.ray + 0x100) =
                           (uint)(bVar81 & 1) * *(int *)(local_890.hit + 0x40) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_890.ray + 0x100);
                      *(uint *)(local_890.ray + 0x104) =
                           (uint)bVar5 * iVar65 | (uint)!bVar5 * *(int *)(local_890.ray + 0x104);
                      *(uint *)(local_890.ray + 0x108) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_890.ray + 0x108);
                      *(uint *)(local_890.ray + 0x10c) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_890.ray + 0x10c);
                      auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x50));
                      *(undefined1 (*) [16])(local_890.ray + 0x110) = auVar87;
                      auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x60));
                      *(undefined1 (*) [16])(local_890.ray + 0x120) = auVar87;
                      auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x70));
                      *(undefined1 (*) [16])(local_890.ray + 0x130) = auVar87;
                      auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x80));
                      *(undefined1 (*) [16])(local_890.ray + 0x140) = auVar87;
                      break;
                    }
                  }
                  auVar228 = ZEXT464((uint)fVar240);
                  *(float *)(ray + k * 4 + 0x80) = fVar240;
                  break;
                }
              }
              lVar79 = lVar79 + -1;
            } while (lVar79 != 0);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar158._4_4_ = uVar166;
            auVar158._0_4_ = uVar166;
            auVar158._8_4_ = uVar166;
            auVar158._12_4_ = uVar166;
            auVar158._16_4_ = uVar166;
            auVar158._20_4_ = uVar166;
            auVar158._24_4_ = uVar166;
            auVar158._28_4_ = uVar166;
            auVar69._4_4_ = fStack_3dc;
            auVar69._0_4_ = local_3e0;
            auVar69._8_4_ = fStack_3d8;
            auVar69._12_4_ = fStack_3d4;
            auVar69._16_4_ = fStack_3d0;
            auVar69._20_4_ = fStack_3cc;
            auVar69._24_4_ = fStack_3c8;
            auVar69._28_4_ = fStack_3c4;
            uVar13 = vcmpps_avx512vl(auVar158,auVar69,0xd);
            bVar80 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar80 & (byte)uVar13;
          } while (bVar80 != 0);
          auVar134 = local_400;
          fVar235 = (float)local_6e0._0_4_;
          fVar238 = (float)local_6e0._4_4_;
          fVar239 = fStack_6d8;
          fVar240 = fStack_6d4;
          fVar213 = fStack_6d0;
          fVar214 = fStack_6cc;
          fVar215 = fStack_6c8;
          fVar207 = fStack_6c4;
        }
        uVar15 = vpcmpgtd_avx512vl(auVar134,local_3a0);
        uVar16 = vpcmpd_avx512vl(local_3a0,local_320,1);
        auVar202._0_4_ = fVar235 + (float)local_200._0_4_;
        auVar202._4_4_ = fVar238 + (float)local_200._4_4_;
        auVar202._8_4_ = fVar239 + fStack_1f8;
        auVar202._12_4_ = fVar240 + fStack_1f4;
        auVar202._16_4_ = fVar213 + fStack_1f0;
        auVar202._20_4_ = fVar214 + fStack_1ec;
        auVar202._24_4_ = fVar215 + fStack_1e8;
        auVar202._28_4_ = fVar207 + fStack_1e4;
        uVar13 = vcmpps_avx512vl(auVar202,auVar158,2);
        bVar74 = bVar74 & (byte)uVar16 & (byte)uVar13;
        auVar203._0_4_ = fVar235 + local_380._0_4_;
        auVar203._4_4_ = fVar238 + local_380._4_4_;
        auVar203._8_4_ = fVar239 + local_380._8_4_;
        auVar203._12_4_ = fVar240 + local_380._12_4_;
        auVar203._16_4_ = fVar213 + local_380._16_4_;
        auVar203._20_4_ = fVar214 + local_380._20_4_;
        auVar203._24_4_ = fVar215 + local_380._24_4_;
        auVar203._28_4_ = fVar207 + local_380._28_4_;
        uVar13 = vcmpps_avx512vl(auVar203,auVar158,2);
        bVar72 = bVar72 & (byte)uVar15 & (byte)uVar13 | bVar74;
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar265 = ZEXT3264(auVar100);
        prim = local_5f0;
        if (bVar72 != 0) {
          abStack_180[uVar75 * 0x60] = bVar72;
          auVar136._0_4_ =
               (uint)(bVar74 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar74 & 1) * (int)local_380._0_4_;
          bVar5 = (bool)(bVar74 >> 1 & 1);
          auVar136._4_4_ = (uint)bVar5 * local_200._4_4_ | (uint)!bVar5 * (int)local_380._4_4_;
          bVar5 = (bool)(bVar74 >> 2 & 1);
          auVar136._8_4_ = (uint)bVar5 * (int)fStack_1f8 | (uint)!bVar5 * (int)local_380._8_4_;
          bVar5 = (bool)(bVar74 >> 3 & 1);
          auVar136._12_4_ = (uint)bVar5 * (int)fStack_1f4 | (uint)!bVar5 * (int)local_380._12_4_;
          bVar5 = (bool)(bVar74 >> 4 & 1);
          auVar136._16_4_ = (uint)bVar5 * (int)fStack_1f0 | (uint)!bVar5 * (int)local_380._16_4_;
          bVar5 = (bool)(bVar74 >> 5 & 1);
          auVar136._20_4_ = (uint)bVar5 * (int)fStack_1ec | (uint)!bVar5 * (int)local_380._20_4_;
          auVar136._24_4_ =
               (uint)(bVar74 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar74 >> 6) * (int)local_380._24_4_;
          auVar136._28_4_ = local_380._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar136;
          uVar77 = vmovlps_avx(local_3b0);
          (&uStack_140)[uVar75 * 0xc] = uVar77;
          aiStack_138[uVar75 * 0x18] = iVar76 + 1;
          uVar75 = (ulong)((int)uVar75 + 1);
        }
      }
    }
    do {
      uVar84 = (uint)uVar75;
      uVar75 = (ulong)(uVar84 - 1);
      if (uVar84 == 0) {
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar34._4_4_ = uVar166;
        auVar34._0_4_ = uVar166;
        auVar34._8_4_ = uVar166;
        auVar34._12_4_ = uVar166;
        auVar34._16_4_ = uVar166;
        auVar34._20_4_ = uVar166;
        auVar34._24_4_ = uVar166;
        auVar34._28_4_ = uVar166;
        uVar13 = vcmpps_avx512vl(local_300,auVar34,2);
        uVar78 = (uint)local_5e8 & (uint)uVar13;
        local_5e8 = (ulong)uVar78;
        if (uVar78 == 0) {
          return;
        }
        goto LAB_01d6aa46;
      }
      lVar79 = uVar75 * 0x60;
      auVar100 = *(undefined1 (*) [32])(auStack_160 + lVar79);
      auVar178._0_4_ = fVar235 + auVar100._0_4_;
      auVar178._4_4_ = fVar238 + auVar100._4_4_;
      auVar178._8_4_ = fVar239 + auVar100._8_4_;
      auVar178._12_4_ = fVar240 + auVar100._12_4_;
      auVar178._16_4_ = fVar213 + auVar100._16_4_;
      auVar178._20_4_ = fVar214 + auVar100._20_4_;
      auVar178._24_4_ = fVar215 + auVar100._24_4_;
      auVar178._28_4_ = fVar207 + auVar100._28_4_;
      uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar33._4_4_ = uVar166;
      auVar33._0_4_ = uVar166;
      auVar33._8_4_ = uVar166;
      auVar33._12_4_ = uVar166;
      auVar33._16_4_ = uVar166;
      auVar33._20_4_ = uVar166;
      auVar33._24_4_ = uVar166;
      auVar33._28_4_ = uVar166;
      uVar13 = vcmpps_avx512vl(auVar178,auVar33,2);
      uVar83 = (uint)uVar13 & (uint)abStack_180[lVar79];
    } while (uVar83 == 0);
    uVar77 = (&uStack_140)[uVar75 * 0xc];
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar77;
    auVar201._8_4_ = 0x7f800000;
    auVar201._0_8_ = 0x7f8000007f800000;
    auVar201._12_4_ = 0x7f800000;
    auVar201._16_4_ = 0x7f800000;
    auVar201._20_4_ = 0x7f800000;
    auVar201._24_4_ = 0x7f800000;
    auVar201._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar201,auVar100);
    bVar72 = (byte)uVar83;
    auVar132._0_4_ =
         (uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar100._0_4_;
    bVar5 = (bool)((byte)(uVar83 >> 1) & 1);
    auVar132._4_4_ = (uint)bVar5 * auVar98._4_4_ | (uint)!bVar5 * (int)auVar100._4_4_;
    bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
    auVar132._8_4_ = (uint)bVar5 * auVar98._8_4_ | (uint)!bVar5 * (int)auVar100._8_4_;
    bVar5 = (bool)((byte)(uVar83 >> 3) & 1);
    auVar132._12_4_ = (uint)bVar5 * auVar98._12_4_ | (uint)!bVar5 * (int)auVar100._12_4_;
    bVar5 = (bool)((byte)(uVar83 >> 4) & 1);
    auVar132._16_4_ = (uint)bVar5 * auVar98._16_4_ | (uint)!bVar5 * (int)auVar100._16_4_;
    bVar5 = (bool)((byte)(uVar83 >> 5) & 1);
    auVar132._20_4_ = (uint)bVar5 * auVar98._20_4_ | (uint)!bVar5 * (int)auVar100._20_4_;
    bVar5 = (bool)((byte)(uVar83 >> 6) & 1);
    auVar132._24_4_ = (uint)bVar5 * auVar98._24_4_ | (uint)!bVar5 * (int)auVar100._24_4_;
    auVar132._28_4_ =
         (uVar83 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar83 >> 7,0) * (int)auVar100._28_4_;
    auVar100 = vshufps_avx(auVar132,auVar132,0xb1);
    auVar100 = vminps_avx(auVar132,auVar100);
    auVar98 = vshufpd_avx(auVar100,auVar100,5);
    auVar100 = vminps_avx(auVar100,auVar98);
    auVar98 = vpermpd_avx2(auVar100,0x4e);
    auVar100 = vminps_avx(auVar100,auVar98);
    uVar13 = vcmpps_avx512vl(auVar132,auVar100,0);
    bVar74 = (byte)uVar13 & bVar72;
    if (bVar74 != 0) {
      uVar83 = (uint)bVar74;
    }
    uVar137 = 0;
    for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
      uVar137 = uVar137 + 1;
    }
    iVar76 = aiStack_138[uVar75 * 0x18];
    bVar72 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar72;
    abStack_180[lVar79] = bVar72;
    if (bVar72 == 0) {
      uVar84 = uVar84 - 1;
    }
    uVar166 = (undefined4)uVar77;
    auVar154._4_4_ = uVar166;
    auVar154._0_4_ = uVar166;
    auVar154._8_4_ = uVar166;
    auVar154._12_4_ = uVar166;
    auVar154._16_4_ = uVar166;
    auVar154._20_4_ = uVar166;
    auVar154._24_4_ = uVar166;
    auVar154._28_4_ = uVar166;
    auVar87 = vmovshdup_avx(auVar167);
    auVar87 = vsubps_avx(auVar87,auVar167);
    auVar179._0_4_ = auVar87._0_4_;
    auVar179._4_4_ = auVar179._0_4_;
    auVar179._8_4_ = auVar179._0_4_;
    auVar179._12_4_ = auVar179._0_4_;
    auVar179._16_4_ = auVar179._0_4_;
    auVar179._20_4_ = auVar179._0_4_;
    auVar179._24_4_ = auVar179._0_4_;
    auVar179._28_4_ = auVar179._0_4_;
    auVar87 = vfmadd132ps_fma(auVar179,auVar154,_DAT_01faff20);
    _local_500 = ZEXT1632(auVar87);
    local_3b0._8_8_ = 0;
    local_3b0._0_8_ = *(ulong *)(local_500 + (ulong)uVar137 * 4);
    uVar75 = (ulong)uVar84;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }